

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu.c
# Opt level: O2

MPP_RET vdpu_av1d_gen_regs(void *hal,HalTaskInfo *task)

{
  HalBufs *bufs;
  anon_struct_108_21_836bd69b *paVar1;
  FilmGrainMemory *scaling_lut;
  char cVar2;
  UCHAR UVar3;
  ushort uVar4;
  ushort uVar5;
  byte bVar6;
  anon_struct_4_11_fc3ab2b4_for_swreg3 aVar7;
  anon_struct_4_25_9d147ffd_for_swreg5 aVar8;
  anon_struct_4_6_6b3e87ec_for_swreg22 aVar9;
  anon_struct_4_6_8162041a_for_swreg23 aVar10;
  anon_struct_4_6_8c43d0ff_for_swreg24 aVar11;
  anon_struct_4_6_1cc34941_for_swreg25 aVar12;
  anon_struct_4_6_9786faf9_for_swreg26 aVar13;
  anon_struct_4_6_a6507eae_for_swreg27 aVar14;
  anon_struct_4_14_914205bb_for_swreg7 aVar15;
  anon_struct_4_4_56b39857_for_swreg28 aVar16;
  anon_struct_4_4_36e9efea_for_swreg29 aVar17;
  anon_struct_4_6_bb133afb_for_swreg8 aVar18;
  anon_struct_4_10_0fd9c99d_for_swreg13 aVar19;
  anon_struct_4_7_653512df_for_swreg31 aVar20;
  anon_struct_4_7_66f87b3f_for_swreg32 aVar21;
  anon_struct_4_11_260badcd_for_swreg320 aVar22;
  VdpuAv1dRegCtx *ctx;
  DXVA_PicParams_AV1 *dxva;
  VdpuAv1dRegSet *__s;
  VdpuAv1dRegSet *pVVar23;
  undefined4 uVar24;
  anon_struct_4_6_2eba39e9_for_swreg16 aVar25;
  anon_struct_4_6_307da249_for_swreg17 aVar26;
  anon_struct_4_6_a90b2738_for_swreg18 aVar27;
  anon_struct_4_6_fc300d31_for_swreg19 aVar28;
  RK_S8 RVar29;
  uint uVar30;
  RK_S32 RVar31;
  RK_U32 RVar32;
  MPP_RET MVar33;
  MppFrameFormat MVar34;
  RK_U32 RVar35;
  anon_struct_4_1_125fc4d2_for_swreg67 aVar36;
  anon_struct_4_10_545f55a1_for_swreg9 aVar37;
  RK_S32 RVar38;
  RK_S32 RVar39;
  RK_S32 RVar40;
  RK_S32 RVar41;
  RK_S32 RVar42;
  anon_struct_4_1_24a8d9ad_for_swreg81 aVar43;
  anon_struct_4_1_5b01d5f0_for_swreg95 aVar44;
  anon_struct_4_6_c35305d8_for_swreg10 aVar45;
  anon_struct_4_1_1bae43a1_for_swreg167 aVar46;
  anon_struct_4_1_4038c17b_for_swreg65 aVar47;
  anon_struct_4_1_82573765_for_swreg99 aVar48;
  anon_struct_4_1_169ba666_for_swreg133 aVar49;
  anon_struct_4_1_c37ab20f_for_swreg169 aVar50;
  anon_struct_4_1_4e3bf742_for_swreg175 aVar51;
  anon_struct_4_1_23975d0d_for_swreg177 aVar52;
  anon_struct_4_1_111c466e_for_swreg326 aVar53;
  anon_struct_4_1_6d573f12_for_swreg328 aVar54;
  anon_struct_4_1_37abd1af_for_swreg505 aVar55;
  VdpuAv1dRegCtx *pVVar56;
  size_t sVar57;
  void *pvVar58;
  char *pcVar59;
  ulong uVar60;
  anon_union_8_1_505ef4a8_for__DXVA_PicParams_AV1_10 aVar61;
  HalBuf *pHVar62;
  RK_S16 *pRVar63;
  sbyte sVar64;
  byte bVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  anon_struct_4_8_3e79bdc5_for_swreg59 aVar75;
  long lVar76;
  undefined1 *puVar77;
  byte bVar78;
  RK_S32 *pRVar79;
  ulong uVar80;
  char *pcVar81;
  anon_struct_108_21_836bd69b *paVar82;
  int iVar83;
  UINT32 UVar84;
  uint uVar85;
  ulong uVar86;
  ulong uVar87;
  long lVar88;
  long lVar89;
  ulong uVar90;
  UCHAR *pUVar91;
  uint uVar92;
  int iVar93;
  int iVar94;
  RK_S32 *pRVar95;
  long lVar96;
  int iVar97;
  UINT32 UVar98;
  undefined1 *puVar99;
  RK_S32 downscaledLumaPlaneW;
  ulong uVar100;
  anon_struct_4_14_b2705f36_for_swreg11 aVar101;
  RK_S32 *pRVar102;
  UINT32 *pUVar103;
  int iVar104;
  bool bVar105;
  bool bVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  uint local_93c8;
  int local_9398;
  MppBuffer buffer;
  uint local_937c;
  MppFrame mframe;
  RK_U32 local_936c;
  RK_U32 local_9368;
  uint local_9364;
  ulong local_9360;
  MppBuffer streambuf;
  HalBuf *local_9350;
  RK_U8 mf_types [3];
  RK_S32 refs_selected [3];
  RK_S32 ar_coeffs_y [24];
  RK_S32 ref_count [24];
  undefined1 local_91a8;
  uint local_91a4;
  uint local_91a0;
  uint local_919c;
  uint local_9198;
  uint local_9194;
  uint local_9190;
  uint local_918c;
  undefined1 local_9188;
  uint local_9184;
  uint local_9180;
  uint local_917c;
  uint local_9178;
  uint local_9174;
  uint local_9170;
  uint local_916c;
  undefined1 local_9168;
  uint local_9164;
  uint local_9160;
  uint local_915c;
  uint local_9158;
  uint local_9154;
  uint local_9150;
  uint local_914c;
  undefined1 local_9148;
  uint local_9144;
  uint local_9140;
  uint local_913c;
  uint local_9138;
  uint local_9134;
  uint local_9130;
  uint local_912c;
  undefined1 local_9128;
  uint local_9124;
  uint local_9120;
  uint local_911c;
  uint local_9118;
  uint local_9114;
  uint local_9110;
  uint local_910c;
  uint auStack_9108 [683];
  undefined1 local_865c [20964];
  RK_S32 cur_offset [7];
  undefined1 local_3040 [5608];
  undefined1 local_1a58 [16];
  uint local_1a48;
  uint local_1a44;
  uint local_1a40;
  undefined1 local_1620 [5616];
  
  ctx = *(VdpuAv1dRegCtx **)((long)hal + 0x50);
  dxva = (DXVA_PicParams_AV1 *)(task->dec).syntax.data;
  buffer = (MppBuffer)0x0;
  streambuf = (MppBuffer)0x0;
  uVar4 = dxva->height;
  local_9360 = (ulong)dxva->width;
  uVar85 = 1 << (dxva->tile_cols_log2 & 0x1f);
  ctx->refresh_frame_flags = (uint)dxva->refresh_frame_flags;
  uVar86 = *(ulong *)((long)task + 8);
  if ((uVar86 & 0xc) != 0) {
    _mpp_log_l(2,"hal_av1d_vdpu","parse err %d ref err %d\n","vdpu_av1d_gen_regs",
               (ulong)((uint)(uVar86 >> 2) & 1),(ulong)((uint)uVar86 >> 3 & 1));
    return MPP_OK;
  }
  if (*(int *)((long)hal + 0x58) != 0) {
    pVVar56 = ctx;
    for (lVar76 = 0; lVar76 != 3; lVar76 = lVar76 + 1) {
      if (pVVar56->reg_buf[0].valid == 0) {
        (task->dec).reg_index = (RK_S32)lVar76;
        ctx->regs = pVVar56->reg_buf[0].regs;
        pVVar56->reg_buf[0].valid = 1;
        break;
      }
      pVVar56 = (VdpuAv1dRegCtx *)(pVVar56->reg_buf + 1);
    }
  }
  __s = ctx->regs;
  memset(__s,0,0x800);
  lVar76 = *(long *)((long)hal + 0x50);
  uVar30 = (uint)dxva->bitdepth * (uint)dxva->max_width + 0x7f >> 3 & 0xffffff0;
  uVar66 = (dxva->max_height + 0xf & 0xfffffff0) * uVar30;
  uVar86 = (ulong)((uVar66 >> 1) +
                   ((dxva->max_width + 0x3f >> 6) * 0x300 + 0x300) *
                   ((dxva->max_height + 0x3f >> 6) + 1) + uVar66 + 0x200);
  if (*(ulong *)(lVar76 + 0x1e7c0) < uVar86) {
    *(uint *)(lVar76 + 0x1b470) = uVar30;
    *(uint *)(lVar76 + 0x1b478) = uVar66;
    *(uint *)(lVar76 + 0x1b47c) = uVar66 >> 1;
    *(ulong *)(lVar76 + 0x1e7c0) = uVar86;
    bufs = (HalBufs *)(lVar76 + 0x1e7b0);
    if (*(HalBufs *)(lVar76 + 0x1e7b0) != (HalBufs)0x0) {
      hal_bufs_deinit(*(HalBufs *)(lVar76 + 0x1e7b0));
      *bufs = (HalBufs)0x0;
    }
    hal_bufs_init(bufs);
    if (*bufs == (HalBufs)0x0) {
      _mpp_log_l(2,"hal_av1d_vdpu","tile out bufs init fail\n","vdpu_av1d_setup_tile_bufs");
    }
    else {
      RVar31 = mpp_buf_slot_get_count(*(MppBufSlots *)((long)hal + 0x20));
      *(RK_S32 *)(lVar76 + 0x1e7b8) = RVar31;
      hal_bufs_setup(*(HalBufs *)(lVar76 + 0x1e7b0),RVar31,1,(size_t *)(lVar76 + 0x1e7c0));
    }
  }
  if (ctx->filter_mem == (MppBuffer)0x0) {
LAB_0020b1b3:
    uVar30 = dxva->height + 0x3f;
    bVar6 = dxva->tile_cols_log2;
    ctx->filt_info[0].offset = 0;
    uVar66 = uVar30 & 0xffffffc0;
    uVar92 = uVar66 * 0xf + 0x7f & 0xffffff80;
    ctx->filt_info[0].size = uVar92;
    iVar93 = uVar92 + uVar66 * 8;
    uVar30 = uVar30 >> 6;
    ctx->filt_info[1].offset = uVar92 << (bVar6 & 0x1f);
    ctx->filt_info[1].size = uVar66 * 8;
    ctx->filt_info[2].offset = iVar93 << (bVar6 & 0x1f);
    uVar92 = uVar30 * 0x370 + 0x7f & 0xffffff80;
    ctx->filt_info[2].size = uVar92;
    iVar93 = uVar92 + iVar93;
    ctx->filt_info[3].offset = iVar93 << (bVar6 & 0x1f);
    uVar30 = uVar30 * 0x10e0 + 0x7f & 0xffffff80;
    ctx->filt_info[3].size = uVar30;
    iVar93 = uVar30 + iVar93;
    ctx->filt_info[4].offset = iVar93 << (bVar6 & 0x1f);
    RVar32 = (uVar66 + 0x47 >> 6) * 0x780;
    ctx->filt_info[4].size = RVar32;
    MVar33 = mpp_buffer_get_with_tag
                       (*(MppBufferGroup *)((long)hal + 0x38),&ctx->filter_mem,
                        (ulong)((iVar93 + RVar32 << (bVar6 & 0x1f)) + 0xfff & 0xfffff000),
                        "hal_av1d_vdpu","vdpu_av1d_filtermem_alloc");
    if (MVar33 != MPP_OK) {
      _mpp_log_l(2,"hal_av1d_vdpu","filt buffer get fail\n",(char *)0x0);
      vdpu_av1d_filtermem_release(ctx);
    }
  }
  else if ((ctx->height < (uint)uVar4) || (ctx->num_tile_cols < uVar85)) {
    vdpu_av1d_filtermem_release(ctx);
    goto LAB_0020b1b3;
  }
  ctx->width = (RK_U32)local_9360;
  ctx->height = (uint)uVar4;
  ctx->num_tile_cols = uVar85;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)hal + 0x20),(task->dec).output,SLOT_FRAME_PTR,&mframe);
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x20),(task->dec).output,SLOT_BUFFER,&buffer);
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x28),(task->dec).input,SLOT_BUFFER,&streambuf)
  ;
  local_9350 = hal_bufs_get_buf(ctx->tile_out_bufs,(task->dec).output);
  local_9368 = mpp_frame_get_hor_stride(mframe);
  local_936c = mpp_frame_get_ver_stride(mframe);
  ctx->ver_stride = local_936c;
  sVar57 = mpp_packet_get_length((task->dec).input_packet);
  *(int *)((long)hal + 0x10) = (int)sVar57;
  MVar34 = mpp_frame_get_fmt(mframe);
  ctx->fbc_en = (MVar34 & 0xf00000) != MPP_FMT_YUV420SP;
  if (((byte)hal_av1d_debug & 8) != 0) {
    uVar5 = dxva->bitdepth;
    MVar34 = mpp_frame_get_fmt(mframe);
    _mpp_log_l(4,"hal_av1d_vdpu","bitdepth %d fmt %d [%d : %d] wxh [%d : %d] uxv [%d : %d]\n",
               (char *)0x0,(ulong)uVar5,(ulong)MVar34,(ulong)(dxva->format).subsampling_x,
               (ulong)(dxva->format).subsampling_y,(ulong)ctx->width,(ulong)ctx->height,
               (ulong)(uint)ctx->hor_stride,(ulong)(uint)ctx->ver_stride);
  }
  local_9364 = (uint)uVar4;
  __s->swreg1 = (anon_struct_4_23_b69a4f09_for_swreg1)(((uint)__s->swreg1 & 0xffffff5e) + 1);
  puVar77 = &(__s->swreg2).field_0x1;
  *puVar77 = *puVar77 | 4;
  aVar7 = __s->swreg3;
  __s->swreg3 = (anon_struct_4_11_fc3ab2b4_for_swreg3)((uint)aVar7 & 0x7ffffff | 0x88000000);
  __s->swreg3 = (anon_struct_4_11_fc3ab2b4_for_swreg3)
                (((uint)aVar7 & 0x3feeeff | 0x88000000) +
                 ((uint)((ulong)dxva->field_10 >> 6) & 0x4000000) + 0x1100);
  aVar8 = __s->swreg5;
  uVar85 = (uint)((ulong)dxva->field_10 >> 0x1b) & 0x800;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)((uint)aVar8 & 0xfffff7ff | uVar85);
  uVar30 = ((dxva->loop_filter).delta_lf_res & 3) << 0x17;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)((uint)aVar8 & 0xfe7ff7ff | uVar85 | uVar30);
  uVar66 = ((dxva->loop_filter).delta_lf_multi & 1) << 0x16;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)
                ((uint)aVar8 & 0xfe3ff7ff | uVar85 | uVar30 | uVar66);
  uVar92 = ((dxva->loop_filter).delta_lf_present & 1) << 0x15;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)
                ((uint)aVar8 & 0xfe1ff7ff | uVar85 | uVar30 | uVar66 | uVar92);
  uVar67 = *(uint *)&dxva->field_10 >> 0xb & 0x80000;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)
                ((uint)aVar8 & 0xfe17f7ff | uVar85 | uVar30 | uVar66 | uVar92 | uVar67);
  aVar8 = (anon_struct_4_25_9d147ffd_for_swreg5)
          (((uint)aVar8 & 0xfe13f7ff | uVar85 | uVar30 | uVar66 | uVar92 | uVar67) +
          (*(uint *)&dxva->field_10 & 0x10000) * 4);
  __s->swreg5 = aVar8;
  uVar85 = ((dxva->format).show_frame & 1) << 0x10;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)((uint)aVar8 & 0xfffeffff | uVar85);
  uVar30 = *(uint *)&dxva->field_10 >> 0xc & 0x8000;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)((uint)aVar8 & 0xfffe7fff | uVar85 | uVar30);
  uVar66 = 0x4000;
  if (((((dxva->cdef).bits == '\0') && ((dxva->cdef).damping == '\0')) &&
      ((dxva->cdef).y_strengths[0].primary == '\0')) &&
     (((dxva->cdef).y_strengths[0].secondary == '\0' &&
      ((dxva->cdef).uv_strengths[0].primary == '\0')))) {
    uVar66 = (uint)((dxva->cdef).uv_strengths[0].secondary != '\0') << 0xe;
  }
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)
                ((uint)aVar8 & 0xfffe3fff | uVar85 | uVar30 | uVar66);
  uVar92 = *(uint *)&dxva->field_10 >> 2 & 0x2000;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)
                ((uint)aVar8 & 0xfffe1fff | uVar85 | uVar30 | uVar66 | uVar92);
  uVar67 = *(uint *)&dxva->field_10 >> 2 & 0x1000;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)
                ((uint)aVar8 & 0xfffe0fff | uVar85 | uVar30 | uVar66 | uVar92 | uVar67);
  uVar68 = *(uint *)&dxva->field_10 >> 3 & 0x400;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)
                ((uint)aVar8 & 0xfffe0bff | uVar85 | uVar30 | uVar66 | uVar92 | uVar67 | uVar68);
  uVar69 = *(uint *)&dxva->field_10 >> 0x13 & 0x200;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)
                ((uint)aVar8 & 0xfffe09ff | uVar85 | uVar30 | uVar66 | uVar92 | uVar67 | uVar68 |
                uVar69);
  uVar70 = *(uint *)&dxva->field_10 >> 10 & 0x100;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)
                ((uint)aVar8 & 0xfffe08ff | uVar85 | uVar30 | uVar66 | uVar92 | uVar67 | uVar68 |
                 uVar69 | uVar70);
  uVar71 = *(uint *)&dxva->field_10 >> 10 & 0x80;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)
                ((uint)aVar8 & 0xfffe087f | uVar85 | uVar30 | uVar66 | uVar92 | uVar67 | uVar68 |
                 uVar69 | uVar70 | uVar71);
  uVar72 = (uint)((ulong)dxva->field_10 >> 0x1b) & 0x40;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)
                ((uint)aVar8 & 0xfffe083f | uVar85 | uVar30 | uVar66 | uVar92 | uVar67 | uVar68 |
                 uVar69 | uVar70 | uVar71 | uVar72);
  uVar73 = *(uint *)&dxva->field_10 >> 0xe & 0x20;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)
                ((uint)aVar8 & 0xfffe081f | uVar85 | uVar30 | uVar66 | uVar92 | uVar67 | uVar68 |
                 uVar69 | uVar70 | uVar71 | uVar72 | uVar73);
  uVar74 = *(uint *)&dxva->field_10 >> 0x15 & 0x10;
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)
                ((uint)aVar8 & 0xfffe080f | uVar85 | uVar30 | uVar66 | uVar92 | uVar67 | uVar68 |
                 uVar69 | uVar70 | uVar71 | uVar72 | uVar73 | uVar74);
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)
                ((uint)aVar8 & 0xfffe0807 | uVar85 | uVar30 | uVar66 | uVar92 | uVar67 | uVar68 |
                 uVar69 | uVar70 | uVar71 | uVar72 | uVar73 | uVar74 |
                *(uint *)&dxva->field_10 >> 0x11 & 8);
  lVar76 = *(long *)((long)hal + 0x50);
  lVar89 = *(long *)(lVar76 + 0x1e7a8);
  pvVar58 = mpp_buffer_get_ptr_with_caller
                      (*(MppBuffer *)(lVar76 + 0x50),"vdpu_av1d_set_global_model");
  paVar1 = dxva->frame_refs;
  pRVar102 = dxva->frame_refs[0].wmmat;
  local_937c = 2;
  for (uVar86 = 0; uVar86 != 7; uVar86 = uVar86 + 1) {
    if ((3 < dxva->frame_refs[uVar86].wmtype) &&
       (_mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "dxva->frame_refs[ref_frame].wmtype <= 3","vdpu_av1d_set_global_model",0x59d),
       (mpp_debug._3_1_ & 0x10) != 0)) {
      abort();
    }
    pvVar58 = (void *)((long)pvVar58 + 8);
    pRVar79 = pRVar102;
    for (lVar88 = 0; lVar88 != 6; lVar88 = lVar88 + 1) {
      pRVar95 = paVar1[uVar86].wmmat + 3;
      if (((int)lVar88 != 2) && (pRVar95 = paVar1[uVar86].wmmat + 2, (int)lVar88 != 3)) {
        pRVar95 = pRVar79;
      }
      *(RK_S32 *)((long)pvVar58 + -8) = *pRVar95;
      pRVar79 = pRVar79 + 1;
      pvVar58 = (void *)((long)pvVar58 + 4);
    }
    *(USHORT *)((long)pvVar58 + -8) = paVar1[uVar86].alpha;
    *(USHORT *)((long)pvVar58 + -6) = paVar1[uVar86].beta;
    *(USHORT *)((long)pvVar58 + -4) = paVar1[uVar86].gamma;
    uVar4 = paVar1[uVar86].delta;
    *(ushort *)((long)pvVar58 + -2) = uVar4;
    if (((byte)hal_av1d_debug & 8) != 0) {
      _mpp_log_l(4,"hal_av1d_vdpu","ref_frame[%d] alpa %d beta %d gamma %d delta %d\n",(char *)0x0,
                 uVar86 & 0xffffffff,(ulong)paVar1[uVar86].alpha,(ulong)paVar1[uVar86].beta,
                 (ulong)paVar1[uVar86].gamma,(ulong)uVar4);
    }
    pRVar102 = pRVar102 + 0x1b;
  }
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar76 + 0x50),0,"vdpu_av1d_set_global_model");
  *(undefined4 *)(lVar89 + 0x148) = 0;
  iVar93 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar76 + 0x50),"vdpu_av1d_set_global_model")
  ;
  *(int *)(lVar89 + 0x14c) = iVar93;
  lVar76 = *(long *)((long)hal + 0x50);
  cVar2 = *(char *)(lVar76 + 0x1e783);
  UVar98 = dxva->frame_tag_size;
  UVar84 = dxva->offset_to_dct_parts;
  iVar93 = *(int *)((long)hal + 0x10);
  pcVar59 = (char *)mpp_buffer_get_ptr_with_caller
                              (*(MppBuffer *)(lVar76 + 0x40),"vdpu_av1d_set_tile_info_mem");
  uVar30 = (uint)(dxva->tiles).widths[(ulong)(cVar2 == '\0') - 3];
  uVar85 = (uint)(dxva->tiles).widths[(ulong)(cVar2 != '\0') - 3];
  uVar4 = (dxva->tiles).cols;
  uVar66 = 0;
  for (uVar86 = 0; uVar4 != uVar86; uVar86 = uVar86 + 1) {
    ref_count[uVar86] = uVar66;
    uVar66 = (uint)(byte)((char)(dxva->tiles).widths[uVar86] + (char)uVar66);
  }
  ref_count[(byte)uVar4] = uVar66;
  uVar4 = (dxva->tiles).rows;
  bVar6 = 0;
  for (uVar86 = 0; uVar4 != uVar86; uVar86 = uVar86 + 1) {
    auStack_9108[uVar86] = (uint)bVar6;
    bVar6 = bVar6 + (char)(dxva->tiles).heights[uVar86];
  }
  uVar66 = iVar93 - (UVar84 + UVar98);
  auStack_9108[(byte)uVar4] = (uint)bVar6;
  iVar93 = 0;
  bVar106 = false;
  for (uVar86 = 0; (uint)uVar86 != uVar30; uVar86 = (ulong)((uint)uVar86 + 1)) {
    uVar100 = 0;
    uVar90 = uVar86;
    while (uVar92 = (uint)uVar100, uVar85 != uVar92) {
      bVar105 = cVar2 == '\0';
      uVar60 = uVar100;
      if (bVar105) {
        uVar60 = uVar86;
      }
      uVar80 = uVar86;
      if (bVar105) {
        uVar80 = uVar100;
      }
      uVar87 = (ulong)(iVar93 + uVar92);
      if (!bVar105) {
        uVar87 = uVar90;
      }
      uVar67 = auStack_9108[uVar60];
      uVar68 = auStack_9108[uVar60 + 1];
      uVar69 = ref_count[uVar80];
      uVar70 = ref_count[uVar80 + 1];
      aVar61 = dxva->field_10;
      if (!bVar106) {
        uVar71 = aVar61._0_4_;
        bVar6 = 1;
        if (((int)uVar80 == (dxva->tiles).cols - 1) || (((ulong)aVar61 & 0x1000) != 0)) {
LAB_0020b9a1:
          bVar78 = 7 - ((uVar71 & 0x1000) == 0);
        }
        else if ((uVar70 - uVar69 == 1) && (((ulong)aVar61 & 0x400000000) != 0)) {
          bVar6 = 0;
          bVar78 = 6;
          if (((byte)hal_av1d_debug & 8) != 0) {
            bVar6 = 0;
            _mpp_log_l(4,"hal_av1d_vdpu","WARNING: Superres used and tile width == 64\n",(char *)0x0
                      );
            aVar61 = dxva->field_10;
            uVar71 = aVar61._0_4_;
            goto LAB_0020b9a1;
          }
        }
        else {
          bVar78 = 6;
        }
        iVar83 = uVar70 - uVar69 << (bVar78 & 0x1f);
        if (((ulong)aVar61 & 0x400000000) == 0) {
          if (0x1000 < iVar83) {
            pcVar81 = "WARNING: Tile width > 4096\n";
            if (((byte)hal_av1d_debug & 8) != 0) goto LAB_0020b9df;
LAB_0020ba3a:
            bVar6 = 0;
          }
        }
        else if (0x8003 < (int)((dxva->superres_denom + 9) * iVar83)) {
          pcVar81 = "WARNING: Tile width after superres > 4096\n";
          if (((byte)hal_av1d_debug & 8) == 0) goto LAB_0020ba3a;
LAB_0020b9df:
          bVar6 = 0;
          _mpp_log_l(4,"hal_av1d_vdpu",pcVar81,(char *)0x0);
          aVar61 = dxva->field_10;
        }
        bVar106 = (bool)(bVar6 ^ 1);
      }
      sVar64 = ((aVar61._0_4_ >> 0xc & 1) != 0) + 6;
      if (((uint)dxva->width <= uVar69 << sVar64) || ((uint)dxva->height <= uVar67 << sVar64)) {
        bVar106 = true;
      }
      *pcVar59 = (char)uVar70 - (char)uVar69;
      pcVar59[1] = '\0';
      pcVar59[2] = '\0';
      pcVar59[3] = '\0';
      pcVar59[4] = (char)uVar68 - (char)uVar67;
      pcVar59[5] = '\0';
      pcVar59[6] = '\0';
      pcVar59[7] = '\0';
      uVar71 = (dxva->tiles).tile_offset_start[uVar87];
      bVar105 = uVar66 < uVar71 + 1;
      if (bVar106) {
        bVar105 = bVar106;
      }
      *(uint *)(pcVar59 + 8) = uVar71;
      uVar72 = (dxva->tiles).tile_offset_end[uVar87];
      *(uint *)(pcVar59 + 0xc) = uVar72;
      bVar106 = uVar66 < uVar72;
      if (bVar105) {
        bVar106 = bVar105;
      }
      if (((byte)hal_av1d_debug & 8) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu",
                   "tile_info[%d][%d]: start=%08x end=%08x x0:x1=%d:%d y0:y1=%d:%d\n",(char *)0x0,
                   uVar86,uVar100,(ulong)uVar71,(ulong)uVar72,(ulong)uVar69,(ulong)uVar70,
                   (ulong)uVar67,(ulong)uVar68);
      }
      pcVar59 = pcVar59 + 0x10;
      uVar90 = (ulong)((int)uVar90 + uVar30);
      uVar100 = (ulong)(uVar92 + 1);
    }
    iVar93 = iVar93 + uVar85;
  }
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar76 + 0x40),0,"vdpu_av1d_set_tile_info_mem");
  if (((dxva->format).frame_type & 0xfd) == 0) {
    uVar85 = SUB84(dxva->field_10,0);
    if ((uVar85 >> 0x19 & 1) != 0) goto LAB_0020bb93;
  }
  else {
    uVar85 = SUB84(dxva->field_10,0);
LAB_0020bb93:
    pVVar23 = ctx->regs;
    ref_count[0x14] = 0;
    ref_count[0x15] = 0;
    ref_count[0x16] = 0;
    ref_count[0x17] = 0;
    ref_count[0x10] = 0;
    ref_count[0x11] = 0;
    ref_count[0x12] = 0;
    ref_count[0x13] = 0;
    ref_count[0xc] = 0;
    ref_count[0xd] = 0;
    ref_count[0xe] = 0;
    ref_count[0xf] = 0;
    ref_count[8] = 0;
    ref_count[9] = 0;
    ref_count[10] = 0;
    ref_count[0xb] = 0;
    ref_count[4] = 0;
    ref_count[5] = 0;
    ref_count[6] = 0;
    ref_count[7] = 0;
    ref_count[0] = 0;
    ref_count[1] = 0;
    ref_count[2] = 0;
    ref_count[3] = 0;
    RVar32 = ctx->luma_size;
    RVar35 = ctx->chroma_size;
    if ((uVar85 >> 0x19 & 1) == 0) {
      for (lVar76 = 0; lVar76 != 0x2f4; lVar76 = lVar76 + 0x6c) {
        lVar89 = (long)*(char *)((long)dxva->frame_refs[0].wmmat + lVar76 + -4);
        if (-1 < lVar89) {
          ref_count[lVar89] = ref_count[lVar89] + 1;
        }
      }
      for (lVar76 = 0; lVar76 != 0x18; lVar76 = lVar76 + 1) {
        if (ref_count[lVar76] != 0) {
          pVVar23->swreg4 =
               (anon_struct_4_4_dea6aa23_for_swreg4)
               ((uint)pVVar23->swreg4 & 0xfffffff0 | (int)pVVar23->swreg4 + 1U & 0xf);
        }
      }
    }
    else {
      pVVar23->swreg4 =
           (anon_struct_4_4_dea6aa23_for_swreg4)(((uint)pVVar23->swreg4 & 0xfffffff0) + 1);
    }
    uVar4 = dxva->width;
    uVar85 = (uint)uVar4;
    uVar5 = dxva->height;
    uVar30 = (uint)uVar5;
    lVar76 = *(long *)((long)hal + 0x50);
    if ((dxva->order_hint_bits == '\0') || (((dxva->format).frame_type & 0xfd) == 0)) {
      for (lVar89 = 0; lVar89 != 8; lVar89 = lVar89 + 1) {
        *(undefined4 *)(lVar76 + 0x1e784 + lVar89 * 4) = 0;
      }
    }
    else {
      uVar86 = 0;
      while (uVar90 = uVar86, uVar90 != 7) {
        if (dxva->frame_refs[uVar90].Index < '\0') {
          uVar86 = uVar90 + 1;
        }
        else {
          uVar66 = paVar1[uVar90].order_hint;
          bVar6 = dxva->order_hint;
          RVar31 = GetRelativeDist(dxva,uVar66,(uint)bVar6);
          *(uint *)(lVar76 + 0x1e788 + uVar90 * 4) = (uint)(0 < RVar31);
          uVar86 = uVar90 + 1;
          if (((byte)hal_av1d_debug & 8) != 0) {
            _mpp_log_l(4,"hal_av1d_vdpu","frame_refs[%d] order_hint %d ref_frame_offset %d\n",
                       (char *)0x0,uVar90 & 0xffffffff,(ulong)bVar6,(ulong)uVar66);
          }
        }
      }
    }
    RVar35 = RVar32 + RVar35 + 0x40;
    uVar66 = (uint)(uVar4 >> 1);
    uVar92 = (uint)(uVar5 >> 1);
    local_9398 = 1;
    local_93c8 = 0;
    bVar106 = false;
    paVar82 = paVar1;
    lVar76 = 0;
    while (lVar76 != 7) {
      if (((ulong)dxva->field_10 & 0x2000000) == 0) {
        bVar6 = paVar82->Index;
        if ((char)bVar6 < '\x01') {
          bVar6 = 0;
        }
        uVar67 = (uint)bVar6;
        UVar98 = paVar82->width;
        UVar84 = paVar82->height;
      }
      else {
        uVar67 = (uint)dxva->CurrPicTextureIndex;
        UVar98 = uVar85;
        UVar84 = uVar30;
      }
      uVar24 = (undefined4)(lVar76 + 1);
      switch(uVar24) {
      case 1:
        pVVar23->swreg33 = (anon_struct_4_2_c07f42b4_for_swreg33)(UVar84 & 0xffff | UVar98 << 0x10);
        uVar69 = (UVar98 * 0x4000 + uVar66) / uVar85;
        uVar68 = (UVar84 * 0x4000 + uVar92) / uVar30;
        pVVar23->swreg36 = (anon_struct_4_2_a28d7f19_for_swreg36)(uVar68 & 0xffff | uVar69 << 0x10);
        break;
      case 2:
        pVVar23->swreg34 = (anon_struct_4_2_89a9ecf6_for_swreg34)(UVar84 & 0xffff | UVar98 << 0x10);
        uVar69 = (UVar98 * 0x4000 + uVar66) / uVar85;
        uVar68 = (UVar84 * 0x4000 + uVar92) / uVar30;
        pVVar23->swreg37 = (anon_struct_4_2_3f23d739_for_swreg37)(uVar68 & 0xffff | uVar69 << 0x10);
        break;
      case 3:
        pVVar23->swreg35 = (anon_struct_4_2_52d49738_for_swreg35)(UVar84 & 0xffff | UVar98 << 0x10);
        uVar69 = (UVar98 * 0x4000 + uVar66) / uVar85;
        uVar68 = (UVar84 * 0x4000 + uVar92) / uVar30;
        pVVar23->swreg38 = (anon_struct_4_2_dbba2f59_for_swreg38)(uVar68 & 0xffff | uVar69 << 0x10);
        break;
      case 4:
        pVVar23->swreg43 = (anon_struct_4_2_1bff417a_for_swreg43)(UVar84 & 0xffff | UVar98 << 0x10);
        uVar69 = (UVar98 * 0x4000 + uVar66) / uVar85;
        uVar68 = (UVar84 * 0x4000 + uVar92) / uVar30;
        pVVar23->swreg39 = (anon_struct_4_2_78508779_for_swreg39)(uVar68 & 0xffff | uVar69 << 0x10);
        break;
      case 5:
        pVVar23->swreg44 = (anon_struct_4_2_e529ebbc_for_swreg44)(UVar84 & 0xffff | UVar98 << 0x10);
        uVar69 = (UVar98 * 0x4000 + uVar66) / uVar85;
        uVar68 = (UVar84 * 0x4000 + uVar92) / uVar30;
        pVVar23->swreg40 = (anon_struct_4_2_14e6df99_for_swreg40)(uVar68 & 0xffff | uVar69 << 0x10);
        break;
      case 6:
        pVVar23->swreg45 = (anon_struct_4_2_ae5495fe_for_swreg45)(UVar84 & 0xffff | UVar98 << 0x10);
        uVar69 = (UVar98 * 0x4000 + uVar66) / uVar85;
        uVar68 = (UVar84 * 0x4000 + uVar92) / uVar30;
        pVVar23->swreg41 = (anon_struct_4_2_b17d37b9_for_swreg41)(uVar68 & 0xffff | uVar69 << 0x10);
        break;
      case 7:
        pVVar23->swreg46 = (anon_struct_4_2_777f4040_for_swreg46)(UVar84 & 0xffff | UVar98 << 0x10);
        uVar69 = (UVar98 * 0x4000 + uVar66) / uVar85;
        uVar68 = (UVar84 * 0x4000 + uVar92) / uVar30;
        pVVar23->swreg42 = (anon_struct_4_2_4e138fd9_for_swreg42)(uVar68 & 0xffff | uVar69 << 0x10);
        break;
      default:
        _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
        _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
        uVar69 = (UVar98 * 0x4000 + uVar66) / uVar85;
        uVar68 = (UVar84 * 0x4000 + uVar92) / uVar30;
        _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
        _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
      }
      if (uVar68 != 0x4000 || uVar69 != 0x4000) {
        local_93c8 = 1;
      }
      if (uVar67 == (int)ctx->prev_out_buffer_i) {
        bVar106 = true;
      }
      pHVar62 = hal_bufs_get_buf(ctx->tile_out_bufs,uVar67);
      if (pHVar62 == (HalBuf *)0x0) {
        pcVar81 = "get slots frame buff fail";
        pcVar59 = "set_ref_lum_base";
LAB_0020c182:
        _mpp_log_l(2,"hal_av1d_vdpu",pcVar81,pcVar59);
      }
      else {
        aVar36 = (anon_struct_4_1_125fc4d2_for_swreg67)
                 mpp_buffer_get_fd_with_caller(*pHVar62->buf,"set_ref_lum_base");
        switch(uVar24) {
        case 1:
          (pVVar23->addr_cfg).swreg67 = aVar36;
          break;
        case 2:
          (pVVar23->addr_cfg).swreg69 = (anon_struct_4_1_a7447793_for_swreg69)aVar36;
          break;
        case 3:
          (pVVar23->addr_cfg).swreg71 = (anon_struct_4_1_3c292a54_for_swreg71)aVar36;
          break;
        case 4:
          (pVVar23->addr_cfg).swreg73 = (anon_struct_4_1_d10ddd15_for_swreg73)aVar36;
          break;
        case 5:
          (pVVar23->addr_cfg).swreg75 = (anon_struct_4_1_65f28fd6_for_swreg75)aVar36;
          break;
        case 6:
          (pVVar23->addr_cfg).swreg77 = (anon_struct_4_1_fad74297_for_swreg77)aVar36;
          break;
        case 7:
          (pVVar23->addr_cfg).swreg79 = (anon_struct_4_1_8fbbf558_for_swreg79)aVar36;
          break;
        default:
          pcVar81 = "Error: trying to set invalid reference index.";
          pcVar59 = (char *)0x0;
          goto LAB_0020c182;
        }
      }
      lVar89 = *(long *)(*(long *)((long)hal + 0x50) + 0x1e7a8);
      pHVar62 = hal_bufs_get_buf(ctx->tile_out_bufs,uVar67);
      if (pHVar62 == (HalBuf *)0x0) {
        pcVar81 = "get slots frame buff fail";
        pcVar59 = "set_ref_cb_base";
LAB_0020c21c:
        _mpp_log_l(2,"hal_av1d_vdpu",pcVar81,pcVar59);
      }
      else {
        iVar93 = mpp_buffer_get_fd_with_caller(*pHVar62->buf,"set_ref_cb_base");
        switch(uVar24) {
        case 1:
          mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x65,RVar32);
          *(int *)(lVar89 + 0x194) = iVar93;
          break;
        case 2:
          mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x67,RVar32);
          *(int *)(lVar89 + 0x19c) = iVar93;
          break;
        case 3:
          mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x69,RVar32);
          *(int *)(lVar89 + 0x1a4) = iVar93;
          break;
        case 4:
          mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x6b,RVar32);
          *(int *)(lVar89 + 0x1ac) = iVar93;
          break;
        case 5:
          mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x6d,RVar32);
          *(int *)(lVar89 + 0x1b4) = iVar93;
          break;
        case 6:
          mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x6f,RVar32);
          *(int *)(lVar89 + 0x1bc) = iVar93;
          break;
        case 7:
          mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x71,RVar32);
          *(int *)(lVar89 + 0x1c4) = iVar93;
          break;
        default:
          pcVar81 = "Error: trying to set invalid reference index.";
          pcVar59 = (char *)0x0;
          goto LAB_0020c21c;
        }
      }
      lVar89 = *(long *)(*(long *)((long)hal + 0x50) + 0x1e7a8);
      pHVar62 = hal_bufs_get_buf(ctx->tile_out_bufs,uVar67);
      if (pHVar62 == (HalBuf *)0x0) {
        _mpp_log_l(2,"hal_av1d_vdpu","get slots frame buff fail","set_ref_dbase");
        switch(uVar24) {
        case 1:
          goto switchD_0020c2d9_caseD_1;
        case 2:
          goto switchD_0020c2d9_caseD_2;
        case 3:
          goto switchD_0020c2d9_caseD_3;
        case 4:
          goto switchD_0020c2d9_caseD_4;
        case 5:
          goto switchD_0020c2d9_caseD_5;
        case 6:
          goto switchD_0020c2d9_caseD_6;
        case 7:
          goto switchD_0020c2d9_caseD_7;
        default:
          goto switchD_0020c2d9_default;
        }
      }
      iVar93 = mpp_buffer_get_fd_with_caller(*pHVar62->buf,"set_ref_dbase");
      switch(uVar24) {
      case 1:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x87,RVar35);
        *(int *)(lVar89 + 0x21c) = iVar93;
switchD_0020c2d9_caseD_1:
        (pVVar23->addr_cfg).swreg66 = (anon_struct_4_1_125fc893_for_swreg66)0x0;
        (pVVar23->addr_cfg).swreg100 = (anon_struct_4_1_547e3e7d_for_swreg100)0x0;
        (pVVar23->addr_cfg).swreg134 = (anon_struct_4_1_e8c2ad7e_for_swreg134)0x0;
        uVar67 = (ctx->ref_frame_sign_bias[lVar76 + 1] & 1) << 0x1c;
        aVar75 = pVVar23->swreg59;
        uVar68 = 0xefffffff;
        goto LAB_0020c5e2;
      case 2:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x89,RVar35);
        *(int *)(lVar89 + 0x224) = iVar93;
switchD_0020c2d9_caseD_2:
        (pVVar23->addr_cfg).swreg68 = (anon_struct_4_1_a7447b54_for_swreg68)0x0;
        (pVVar23->addr_cfg).swreg102 = (anon_struct_4_1_e962f13e_for_swreg102)0x0;
        (pVVar23->addr_cfg).swreg136 = (anon_struct_4_1_7da7603f_for_swreg136)0x0;
        uVar67 = (ctx->ref_frame_sign_bias[lVar76 + 1] & 1) << 0x1d;
        aVar75 = pVVar23->swreg59;
        uVar68 = 0xdfffffff;
        goto LAB_0020c5e2;
      case 3:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x8b,RVar35);
        *(int *)(lVar89 + 0x22c) = iVar93;
switchD_0020c2d9_caseD_3:
        (pVVar23->addr_cfg).swreg70 = (anon_struct_4_1_3c292e15_for_swreg70)0x0;
        (pVVar23->addr_cfg).swreg104 = (anon_struct_4_1_7e47a3ff_for_swreg104)0x0;
        (pVVar23->addr_cfg).swreg138 = (anon_struct_4_1_128c1300_for_swreg138)0x0;
        uVar67 = (ctx->ref_frame_sign_bias[lVar76 + 1] & 1) << 0x1e;
        aVar75 = pVVar23->swreg59;
        uVar68 = 0xbfffffff;
        goto LAB_0020c5e2;
      case 4:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x8d,RVar35);
        *(int *)(lVar89 + 0x234) = iVar93;
switchD_0020c2d9_caseD_4:
        (pVVar23->addr_cfg).swreg72 = (anon_struct_4_1_d10de0d6_for_swreg72)0x0;
        (pVVar23->addr_cfg).swreg106 = (anon_struct_4_1_132c56c0_for_swreg106)0x0;
        (pVVar23->addr_cfg).swreg140 = (anon_struct_4_1_a770c5c1_for_swreg140)0x0;
        uVar67 = ctx->ref_frame_sign_bias[lVar76 + 1] << 0x1f;
        aVar75 = pVVar23->swreg59;
        uVar68 = 0x7fffffff;
LAB_0020c5e2:
        pVVar23->swreg59 = (anon_struct_4_8_3e79bdc5_for_swreg59)((uint)aVar75 & uVar68 | uVar67);
        break;
      case 5:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x8f,RVar35);
        *(int *)(lVar89 + 0x23c) = iVar93;
switchD_0020c2d9_caseD_5:
        (pVVar23->addr_cfg).swreg74 = (anon_struct_4_1_65f29397_for_swreg74)0x0;
        (pVVar23->addr_cfg).swreg108 = (anon_struct_4_1_a8110981_for_swreg108)0x0;
        (pVVar23->addr_cfg).swreg142 = (anon_struct_4_1_3c557882_for_swreg142)0x0;
        aVar37 = (anon_struct_4_10_545f55a1_for_swreg9)
                 (((uint)pVVar23->swreg9 & 0xfffffffb) +
                 (ctx->ref_frame_sign_bias[lVar76 + 1] & 1) * 4);
        goto LAB_0020c674;
      case 6:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x91,RVar35);
        *(int *)(lVar89 + 0x244) = iVar93;
switchD_0020c2d9_caseD_6:
        (pVVar23->addr_cfg).swreg76 = (anon_struct_4_1_fad74658_for_swreg76)0x0;
        (pVVar23->addr_cfg).swreg110 = (anon_struct_4_1_3cf5bc42_for_swreg110)0x0;
        (pVVar23->addr_cfg).swreg144 = (anon_struct_4_1_d13a2b43_for_swreg144)0x0;
        aVar37 = (anon_struct_4_10_545f55a1_for_swreg9)
                 (((uint)pVVar23->swreg9 & 0xfffffff7) +
                 (ctx->ref_frame_sign_bias[lVar76 + 1] & 1) * 8);
LAB_0020c674:
        pVVar23->swreg9 = aVar37;
        break;
      case 7:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x93,RVar35);
        *(int *)(lVar89 + 0x24c) = iVar93;
switchD_0020c2d9_caseD_7:
        (pVVar23->addr_cfg).swreg78 = (anon_struct_4_1_8fbbf919_for_swreg78)0x0;
        (pVVar23->addr_cfg).swreg112 = (anon_struct_4_1_d1da6f03_for_swreg112)0x0;
        (pVVar23->addr_cfg).swreg146 = (anon_struct_4_1_661ede04_for_swreg146)0x0;
        pVVar23->swreg9 =
             (anon_struct_4_10_545f55a1_for_swreg9)
             ((uint)pVVar23->swreg9 & 0xffffffef | (ctx->ref_frame_sign_bias[lVar76 + 1] & 1) << 4);
        break;
      default:
        _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
switchD_0020c2d9_default:
        _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
        _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
        _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
        _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
      }
      paVar82 = paVar82 + 1;
      lVar76 = lVar76 + 1;
    }
    pVVar23->swreg184 =
         (anon_struct_4_5_d5c663f9_for_swreg184)
         ((uint)pVVar23->swreg184 & 0xe7ffffff | (dxva->frame_refs[0].wmtype & 3) << 0x1b);
    pVVar23->swreg185 =
         (anon_struct_4_5_7e86ff7e_for_swreg185)
         ((uint)pVVar23->swreg185 & 0xe7ffffff | (dxva->frame_refs[1].wmtype & 3) << 0x1b);
    pVVar23->swreg186 =
         (anon_struct_4_5_d0d94302_for_swreg186)
         ((uint)pVVar23->swreg186 & 0xe7ffffff | (dxva->frame_refs[2].wmtype & 3) << 0x1b);
    pVVar23->swreg187 =
         (anon_struct_4_5_603a5415_for_swreg187)
         ((uint)pVVar23->swreg187 & 0xe7ffffff | (dxva->frame_refs[3].wmtype & 3) << 0x1b);
    pVVar23->swreg188 =
         (anon_struct_4_5_bc441407_for_swreg188)
         ((uint)pVVar23->swreg188 & 0xe7ffffff | (dxva->frame_refs[4].wmtype & 3) << 0x1b);
    pVVar23->swreg257 =
         (anon_struct_4_5_f90917a6_for_swreg257)
         ((uint)pVVar23->swreg257 & 0xe7ffffff | (dxva->frame_refs[5].wmtype & 3) << 0x1b);
    pVVar23->swreg262 =
         (anon_struct_4_5_fe228d5b_for_swreg262)
         ((uint)pVVar23->swreg262 & 0xe7ffffff | (dxva->frame_refs[6].wmtype & 3) << 0x1b);
    if (((ulong)dxva->field_10 & 0x2000000) == 0) {
      if (!bVar106) {
        RVar29 = dxva->frame_refs[0].Index;
        goto LAB_0020c802;
      }
    }
    else {
      RVar29 = (RK_S8)dxva->CurrPicTextureIndex;
LAB_0020c802:
      ctx->prev_out_buffer_i = RVar29;
    }
    uVar85 = (uint)dxva->order_hint;
    refs_selected[2] = 0;
    refs_selected[0] = 0;
    refs_selected[1] = 0;
    uVar4 = dxva->width;
    uVar5 = dxva->height;
    mf_types[2] = '\0';
    mf_types[0] = '\0';
    mf_types[1] = '\0';
    UVar84 = 0;
    UVar98 = 0;
    if (-1 < dxva->frame_refs[6].Index) {
      UVar98 = dxva->frame_refs[6].order_hint;
    }
    if (-1 < dxva->frame_refs[3].Index) {
      UVar84 = dxva->frame_refs[3].order_hint;
    }
    uVar90 = 0;
    uVar86 = 0;
    if (-1 < dxva->frame_refs[4].Index) {
      uVar86 = (ulong)dxva->frame_refs[4].order_hint;
    }
    if (-1 < dxva->frame_refs[5].Index) {
      uVar90 = (ulong)dxva->frame_refs[5].order_hint;
    }
    if (((byte)hal_av1d_debug & 8) != 0) {
      _mpp_log_l(4,"hal_av1d_vdpu","frame_offset[%d %d %d %d] lst_idx %d alt_off %d\n",(char *)0x0,
                 (ulong)UVar98,(ulong)UVar84,uVar86,uVar90,
                 (ulong)(uint)(int)dxva->frame_refs[0].Index,
                 (ulong)dxva->frame_refs[0].alt_frame_offset);
    }
    uVar66 = uVar4 + 7 >> 3;
    uVar30 = uVar5 + 7 >> 3;
    uVar60 = 0;
    uVar100 = 0;
    if (dxva->frame_refs[0].Index < '\0') {
      local_9398 = 2;
    }
    else {
      uVar100 = uVar60;
      if (dxva->frame_refs[0].alt_frame_offset != UVar84) {
        bVar106 = true;
        if (dxva->frame_refs[0].intra_only == 0) {
          bVar106 = dxva->frame_refs[0].is_intra_frame != 0;
        }
        if (((dxva->frame_refs[0].width + 7 >> 3 == uVar66) &&
            (dxva->frame_refs[0].height + 7 >> 3 == uVar30)) && (!bVar106)) {
          refs_selected._0_8_ = refs_selected._0_8_ & 0xffffffff00000000;
          mf_types[0] = '\x01';
          uVar100 = 1;
          local_9398 = 1;
        }
      }
    }
    RVar31 = GetRelativeDist(dxva,(RK_S32)uVar86,uVar85);
    uVar86 = uVar100;
    if (0 < RVar31) {
      bVar106 = true;
      if (dxva->frame_refs[4].intra_only == 0) {
        bVar106 = dxva->frame_refs[4].is_intra_frame != 0;
      }
      if (((dxva->frame_refs[4].width + 7 >> 3 == uVar66) &&
          (dxva->frame_refs[4].height + 7 >> 3 == uVar30)) && (!bVar106)) {
        mf_types[uVar100] = '\x05';
        uVar86 = (ulong)((int)uVar100 + 1);
        refs_selected[uVar100] = 4;
        local_9398 = local_9398 + -1;
      }
    }
    RVar31 = GetRelativeDist(dxva,(RK_S32)uVar90,uVar85);
    uVar90 = uVar86;
    if (0 < RVar31) {
      bVar106 = true;
      if (dxva->frame_refs[5].intra_only == 0) {
        bVar106 = dxva->frame_refs[5].is_intra_frame != 0;
      }
      if (((dxva->frame_refs[5].width + 7 >> 3 == uVar66) &&
          (dxva->frame_refs[5].height + 7 >> 3 == uVar30)) && (!bVar106)) {
        mf_types[uVar86] = '\x06';
        uVar90 = (ulong)((int)uVar86 + 1);
        refs_selected[uVar86] = 5;
        local_9398 = local_9398 + -1;
      }
    }
    RVar31 = GetRelativeDist(dxva,UVar98,uVar85);
    if (local_9398 < 0 || RVar31 < 1) {
LAB_0020cab9:
      uVar92 = (uint)uVar90;
      if (-1 < local_9398) goto LAB_0020cac0;
    }
    else {
      bVar106 = true;
      if (dxva->frame_refs[6].intra_only == 0) {
        bVar106 = dxva->frame_refs[6].is_intra_frame != 0;
      }
      if (((dxva->frame_refs[6].width + 7 >> 3 == uVar66) &&
          (dxva->frame_refs[6].height + 7 >> 3 == uVar30)) && (!bVar106)) {
        mf_types[uVar90] = '\a';
        refs_selected[uVar90] = 6;
        local_9398 = local_9398 + -1;
        uVar90 = (ulong)((int)uVar90 + 1);
        goto LAB_0020cab9;
      }
LAB_0020cac0:
      uVar92 = (uint)uVar90;
      if (-1 < dxva->frame_refs[1].Index) {
        bVar106 = true;
        if (dxva->frame_refs[1].intra_only == 0) {
          bVar106 = dxva->frame_refs[1].is_intra_frame != 0;
        }
        if (((dxva->frame_refs[1].width + 7 >> 3 == uVar66) &&
            (dxva->frame_refs[1].height + 7 >> 3 == uVar30)) && (!bVar106)) {
          mf_types[uVar90] = '\x02';
          uVar92 = uVar92 + 1;
          refs_selected[uVar90] = 1;
        }
      }
    }
    pUVar103 = &dxva->frame_refs[0].order_hint;
    for (uVar86 = 0; uVar86 != 7; uVar86 = uVar86 + 1) {
      cVar2 = *(char *)(pUVar103 + 10);
      if (cVar2 < '\0') {
        cur_offset[uVar86] = 0;
        *(undefined4 *)(local_1a58 + uVar86 * 4) = 0;
      }
      else {
        uVar67 = *pUVar103;
        uVar68 = GetRelativeDist(dxva,uVar85,uVar67);
        cur_offset[uVar86] = uVar68;
        uVar69 = GetRelativeDist(dxva,uVar67,uVar85);
        *(uint *)(local_1a58 + uVar86 * 4) = uVar69;
        if (((byte)hal_av1d_debug & 8) != 0) {
          _mpp_log_l(4,"hal_av1d_vdpu","buf_idx[%d]=%d offset[%d : %d] hin %d\n",(char *)0x0,
                     uVar86 & 0xffffffff,(ulong)(uint)(int)cVar2,(ulong)uVar68,(ulong)uVar69,
                     (ulong)uVar67);
        }
      }
      pUVar103 = pUVar103 + 0x1b;
    }
    aVar101 = (anon_struct_4_14_b2705f36_for_swreg11)((uint)pVVar23->swreg11 & 0xfffffff0);
    pVVar23->swreg11 = aVar101;
    uVar86 = (ulong)dxva->field_10 & 0x4000000000;
    if (((uVar86 != 0) && (uVar92 != 0)) && (cur_offset[(ulong)mf_types[0] - 1] + 0x1fU < 0x3f)) {
      aVar101 = (anon_struct_4_14_b2705f36_for_swreg11)((uint)aVar101 | 8);
      pVVar23->swreg11 = aVar101;
      lVar76 = (long)refs_selected[0];
      UVar98 = dxva->frame_refs[lVar76].order_hint;
      uVar85 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].lst_frame_offset);
      uVar67 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].lst2_frame_offset);
      uVar68 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].lst3_frame_offset);
      uVar69 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].gld_frame_offset);
      RVar31 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].bwd_frame_offset);
      RVar38 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].alt2_frame_offset);
      uVar70 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].alt_frame_offset);
      pVVar23->swreg20 =
           (anon_struct_4_6_b76789ed_for_swreg20)
           ((uint)pVVar23->swreg20 & 0x803fffff | (uVar85 & 0x1ff) << 0x16);
      pVVar23->swreg21 =
           (anon_struct_4_6_034ecb4d_for_swreg21)
           ((uint)pVVar23->swreg21 & 0x803fffff | (uVar67 & 0x1ff) << 0x16);
      pVVar23->swreg22 =
           (anon_struct_4_6_6b3e87ec_for_swreg22)
           ((uint)pVVar23->swreg22 & 0x803fffff | (uVar68 & 0x1ff) << 0x16);
      pVVar23->swreg23 =
           (anon_struct_4_6_8162041a_for_swreg23)
           ((uint)pVVar23->swreg23 & 0x803fffff | (uVar69 & 0x1ff) << 0x16);
      uVar86._0_4_ = pVVar23->swreg24;
      uVar86._4_4_ = pVVar23->swreg25;
      uVar86 = uVar86 & (ulong)DAT_0029c200 |
               CONCAT44(RVar38 << 0x16,RVar31 << 0x16) & (ulong)DAT_0029c1f0;
      pVVar23->swreg24 = (anon_struct_4_6_8c43d0ff_for_swreg24)(int)uVar86;
      pVVar23->swreg25 = (anon_struct_4_6_1cc34941_for_swreg25)(int)(uVar86 >> 0x20);
      pVVar23->swreg26 =
           (anon_struct_4_6_9786faf9_for_swreg26)
           ((uint)pVVar23->swreg26 & 0x803fffff | (uVar70 & 0x1ff) << 0x16);
      uVar86 = (ulong)dxva->field_10 & 0x4000000000;
    }
    if ((uVar86 != 0) && (1 < uVar92)) {
      if (cur_offset[(ulong)mf_types[1] - 1] + 0x1fU < 0x3f) {
        aVar101 = (anon_struct_4_14_b2705f36_for_swreg11)((uint)aVar101 | 4);
        pVVar23->swreg11 = aVar101;
        lVar76 = (long)refs_selected[1];
        UVar98 = dxva->frame_refs[lVar76].order_hint;
        uVar85 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].lst_frame_offset);
        RVar31 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].lst2_frame_offset);
        RVar38 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].lst3_frame_offset);
        RVar39 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].gld_frame_offset);
        RVar40 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].bwd_frame_offset);
        RVar41 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].alt2_frame_offset);
        RVar42 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].alt_frame_offset);
        pVVar23->swreg27 =
             (anon_struct_4_6_a6507eae_for_swreg27)
             ((uint)pVVar23->swreg27 & 0x803fffff | (uVar85 & 0x1ff) << 0x16);
        uVar90._0_4_ = pVVar23->swreg47;
        uVar90._4_4_ = pVVar23->swreg48;
        uVar86 = CONCAT44(RVar42 << 0x12,RVar39 << 0x12) & (ulong)DAT_0029c230 |
                 uVar90 & (ulong)DAT_00292900 |
                 CONCAT44(RVar41 << 9,RVar38 << 9) & (ulong)DAT_0029c220 |
                 CONCAT44(RVar40,RVar31) & (ulong)DAT_0029c210;
        pVVar23->swreg47 = (anon_struct_4_5_8bdbaba8_for_swreg47)(int)uVar86;
        pVVar23->swreg48 = (anon_struct_4_5_5cd422b8_for_swreg48)(int)(uVar86 >> 0x20);
        uVar86 = (ulong)dxva->field_10 & 0x4000000000;
      }
      else {
        uVar86 = 1;
      }
    }
    if (((uVar86 != 0) && (2 < uVar92)) && (cur_offset[(ulong)mf_types[2] - 1] + 0x1fU < 0x3f)) {
      pVVar23->swreg11 = (anon_struct_4_14_b2705f36_for_swreg11)((uint)aVar101 | 2);
      lVar76 = (long)refs_selected[2];
      UVar98 = dxva->frame_refs[lVar76].order_hint;
      uVar85 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].lst_frame_offset);
      uVar92 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].lst2_frame_offset);
      uVar67 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].lst3_frame_offset);
      uVar68 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].gld_frame_offset);
      uVar69 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].bwd_frame_offset);
      uVar70 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].alt2_frame_offset);
      uVar71 = GetRelativeDist(dxva,UVar98,dxva->frame_refs[lVar76].alt_frame_offset);
      pVVar23->swreg184 =
           (anon_struct_4_5_d5c663f9_for_swreg184)
           ((uint)pVVar23->swreg184 & 0xf803ffff | (uVar85 & 0x1ff) << 0x12);
      pVVar23->swreg185 =
           (anon_struct_4_5_7e86ff7e_for_swreg185)
           ((uint)pVVar23->swreg185 & 0xf803ffff | (uVar92 & 0x1ff) << 0x12);
      pVVar23->swreg186 =
           (anon_struct_4_5_d0d94302_for_swreg186)
           ((uint)pVVar23->swreg186 & 0xf803ffff | (uVar67 & 0x1ff) << 0x12);
      pVVar23->swreg187 =
           (anon_struct_4_5_603a5415_for_swreg187)
           ((uint)pVVar23->swreg187 & 0xf803ffff | (uVar68 & 0x1ff) << 0x12);
      pVVar23->swreg188 =
           (anon_struct_4_5_bc441407_for_swreg188)
           ((uint)pVVar23->swreg188 & 0xf803ffff | (uVar69 & 0x1ff) << 0x12);
      pVVar23->swreg257 =
           (anon_struct_4_5_f90917a6_for_swreg257)
           ((uint)pVVar23->swreg257 & 0xf803ffff | (uVar70 & 0x1ff) << 0x12);
      pVVar23->swreg262 =
           (anon_struct_4_5_fe228d5b_for_swreg262)
           ((uint)pVVar23->swreg262 & 0xf803ffff | (uVar71 & 0x1ff) << 0x12);
    }
    if ((((dxva->segmentation).enabled != '\0') && ((ulong)dxva->primary_ref_frame < 7)) &&
       (cVar2 = dxva->frame_refs[dxva->primary_ref_frame].Index, -1 < cVar2)) {
      uVar85 = ctx->luma_size;
      pHVar62 = hal_bufs_get_buf(ctx->tile_out_bufs,(int)cVar2);
      (pVVar23->addr_cfg).swreg80 = (anon_struct_4_1_24a8dd6e_for_swreg80)0x0;
      aVar43 = (anon_struct_4_1_24a8d9ad_for_swreg81)
               mpp_buffer_get_fd_with_caller(*pHVar62->buf,"vdpu_av1d_set_reference_frames");
      (pVVar23->addr_cfg).swreg81 = aVar43;
      mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x51,uVar85 + (uVar85 >> 1) + 0x40);
      *(byte *)&pVVar23->swreg11 = *(byte *)&pVVar23->swreg11 | 1;
    }
    uVar86 = (ulong)dxva->primary_ref_frame;
    if (uVar86 < 7) {
      bVar106 = true;
      if (uVar66 == paVar1[uVar86].width + 7 >> 3) {
        bVar106 = uVar30 != paVar1[uVar86].height + 7 >> 3;
      }
      ctx->resolution_change = bVar106;
    }
    auVar108._0_4_ = pVVar23->swreg184;
    auVar108._4_4_ = pVVar23->swreg185;
    auVar108._8_4_ = pVVar23->swreg186;
    auVar108._12_4_ = pVVar23->swreg187;
    auVar107._0_4_ = cur_offset[0] << 9;
    auVar107._4_4_ = cur_offset[1] << 9;
    auVar107._8_4_ = cur_offset[2] << 9;
    auVar107._12_4_ = cur_offset[3] << 9;
    auVar108 = local_1a58 & _DAT_0029c280 | auVar108 & _DAT_0029c270 | auVar107 & _DAT_0029c260;
    pVVar23->swreg184 = (anon_struct_4_5_d5c663f9_for_swreg184)auVar108._0_4_;
    pVVar23->swreg185 = (anon_struct_4_5_7e86ff7e_for_swreg185)auVar108._4_4_;
    pVVar23->swreg186 = (anon_struct_4_5_d0d94302_for_swreg186)auVar108._8_4_;
    pVVar23->swreg187 = (anon_struct_4_5_603a5415_for_swreg187)auVar108._12_4_;
    pVVar23->swreg188 =
         (anon_struct_4_5_bc441407_for_swreg188)
         (local_1a48 & 0x1ff | (uint)pVVar23->swreg188 & 0xfffc0000 | (cur_offset[4] & 0x1ffU) << 9)
    ;
    pVVar23->swreg257 =
         (anon_struct_4_5_f90917a6_for_swreg257)
         (local_1a44 & 0x1ff | (uint)pVVar23->swreg257 & 0xfffc0000 | (cur_offset[5] & 0x1ffU) << 9)
    ;
    pVVar23->swreg262 =
         (anon_struct_4_5_fe228d5b_for_swreg262)
         (local_1a40 & 0x1ff | (uint)pVVar23->swreg262 & 0xfffc0000 | (cur_offset[6] & 0x1ffU) << 9)
    ;
    pVVar23->swreg9 =
         (anon_struct_4_10_545f55a1_for_swreg9)
         ((uint)(mf_types[2] - 1 & 7) << 0xb |
         (uint)(mf_types[1] - 1 & 7) << 8 |
         (uint)pVVar23->swreg9 & 0xffffc01f | (uint)(byte)(mf_types[0] * ' ' - 0x20));
    if (((byte)hal_av1d_debug & 8) != 0) {
      _mpp_log_l(4,"hal_av1d_vdpu","mf_types[%d %d %d]\n",(char *)0x0,(ulong)mf_types[0],
                 (ulong)mf_types[1],(ulong)mf_types[2]);
    }
    pVVar23->swreg5 =
         (anon_struct_4_25_9d147ffd_for_swreg5)((uint)pVVar23->swreg5 & 0xfffffffe | local_93c8);
  }
  pVVar23 = ctx->regs;
  aVar19 = (anon_struct_4_10_0fd9c99d_for_swreg13)
           (((uint)pVVar23->swreg13 & 0xfffffffb) + ((dxva->segmentation).temporal_update & 1) * 4);
  pVVar23->swreg13 = aVar19;
  aVar19 = (anon_struct_4_10_0fd9c99d_for_swreg13)
           (((uint)aVar19 & 0xfffffffd) + ((dxva->segmentation).update_map & 1) * 2);
  pVVar23->swreg13 = aVar19;
  pVVar23->swreg13 =
       (anon_struct_4_10_0fd9c99d_for_swreg13)
       ((uint)aVar19 & 0xfffffffe | (dxva->segmentation).enabled & 1);
  uVar85 = SUB84(dxva->field_10,4) >> 7 & 4;
  pVVar23->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)((uint)pVVar23->swreg5 & 0xfffffffb | uVar85);
  if ((((dxva->format).frame_type & 0xfd) == 0) || (uVar85 != 0)) {
    *(byte *)&pVVar23->swreg11 = *(byte *)&pVVar23->swreg11 & 0xfe;
  }
  pVVar23->swreg14 =
       (anon_struct_4_6_2b336929_for_swreg14)
       ((uint)pVVar23->swreg14 & 0x3ffffff | (uint)(dxva->loop_filter).filter_level[0] << 0x1a);
  pVVar23->swreg15 =
       (anon_struct_4_6_2cf6d189_for_swreg15)
       ((uint)pVVar23->swreg15 & 0x3ffffff | (uint)(dxva->loop_filter).filter_level[1] << 0x1a);
  pVVar23->swreg16 =
       (anon_struct_4_6_2eba39e9_for_swreg16)
       ((uint)pVVar23->swreg16 & 0x3ffffff | (uint)(dxva->loop_filter).filter_level_u << 0x1a);
  pVVar23->swreg17 =
       (anon_struct_4_6_307da249_for_swreg17)
       ((uint)pVVar23->swreg17 & 0x3ffffff | (uint)(dxva->loop_filter).filter_level_v << 0x1a);
  for (lVar76 = 0; lVar76 != 0x100; lVar76 = lVar76 + 0x20) {
    *(undefined1 (*) [16])((long)ref_count + lVar76 + 0x10) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)ref_count + lVar76) = (undefined1  [16])0x0;
  }
  if ((dxva->segmentation).enabled == '\0') {
    uVar85 = 0;
  }
  else {
    UVar3 = (dxva->format).frame_type;
    lVar89 = 0;
    bVar6 = 0;
    for (lVar76 = 0; lVar76 != 8; lVar76 = lVar76 + 1) {
      bVar78 = (dxva->segmentation).feature_mask[lVar76];
      if ((bVar78 & 1) != 0) {
        uVar85 = *(uint *)((long)(dxva->segmentation).feature_data[0] + lVar89);
        uVar30 = -uVar85;
        if (0 < (int)uVar85) {
          uVar30 = uVar85;
        }
        if (0xfe < uVar30) {
          uVar30 = 0xff;
        }
        *(uint *)((long)ref_count + lVar89) = uVar30;
        bVar6 = bVar6 | (byte)((uVar85 >> 0x1f) << ((byte)lVar76 & 0x1f));
      }
      if ((bVar78 & 2) != 0) {
        iVar93 = *(int *)((long)(dxva->segmentation).feature_data[0] + lVar89 + 4);
        if (0x3e < iVar93) {
          iVar93 = 0x3f;
        }
        if (iVar93 < -0x3e) {
          iVar93 = -0x3f;
        }
        *(int *)((long)ref_count + lVar89 + 4) = iVar93;
      }
      if ((bVar78 & 4) != 0) {
        iVar93 = *(int *)((long)(dxva->segmentation).feature_data[0] + lVar89 + 8);
        if (0x3e < iVar93) {
          iVar93 = 0x3f;
        }
        if (iVar93 < -0x3e) {
          iVar93 = -0x3f;
        }
        *(int *)((long)ref_count + lVar89 + 8) = iVar93;
      }
      if ((bVar78 & 8) != 0) {
        iVar93 = *(int *)((long)(dxva->segmentation).feature_data[0] + lVar89 + 0xc);
        if (0x3e < iVar93) {
          iVar93 = 0x3f;
        }
        if (iVar93 < -0x3e) {
          iVar93 = -0x3f;
        }
        *(int *)((long)ref_count + lVar89 + 0xc) = iVar93;
      }
      if ((bVar78 & 0x10) != 0) {
        iVar93 = *(int *)((long)(dxva->segmentation).feature_data[0] + lVar89 + 0x10);
        if (0x3e < iVar93) {
          iVar93 = 0x3f;
        }
        if (iVar93 < -0x3e) {
          iVar93 = -0x3f;
        }
        *(int *)((long)ref_count + lVar89 + 0x10) = iVar93;
      }
      if ((UVar3 != '\0') && ((bVar78 & 0x20) != 0)) {
        *(int *)((long)ref_count + lVar89 + 0x14) =
             *(int *)((long)(dxva->segmentation).feature_data[0] + lVar89 + 0x14) + 1;
      }
      if ((bVar78 & 0x40) != 0) {
        *(undefined4 *)((long)ref_count + lVar89 + 0x18) = 1;
      }
      if ((char)bVar78 < '\0') {
        *(undefined4 *)((long)ref_count + lVar89 + 0x1c) = 1;
      }
      lVar89 = lVar89 + 0x20;
    }
    uVar85 = (uint)bVar6 << 2;
  }
  bVar78 = 0;
  uVar86 = 0;
  bVar6 = 0;
  for (uVar90 = 0; uVar90 != 8; uVar90 = uVar90 + 1) {
    for (uVar30 = 0; uVar30 != 8; uVar30 = uVar30 + 1) {
      if (((dxva->segmentation).feature_mask[uVar90] >> (uVar30 & 0x1f) & 1) != 0) {
        bVar78 = bVar78 | 4 < uVar30;
        bVar6 = (byte)uVar86;
        if ((byte)uVar86 < (byte)uVar90) {
          uVar86 = uVar90 & 0xff;
          bVar6 = (byte)uVar90;
        }
      }
    }
  }
  pVVar23->swreg9 =
       (anon_struct_4_10_545f55a1_for_swreg9)
       ((uint)pVVar23->swreg9 & 0xfff1ffff | (uint)(bVar6 & 7) << 0x11);
  pVVar23->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)
       ((uint)pVVar23->swreg5 & 0xffefffff | (uint)bVar78 << 0x14);
  pVVar23->swreg12 =
       (anon_struct_4_8_66c0642b_for_swreg12)((uint)pVVar23->swreg12 & 0xfffffc03 | uVar85);
  pVVar23->swreg14 =
       (anon_struct_4_6_2b336929_for_swreg14)
       ((ref_count[6] & 1U) << 0xe |
       (ref_count[5] & 0xfU) << 0xf |
       (ref_count[1] & 0x7fU) << 0x13 |
       (uint)pVVar23->swreg14 & 0xfc003f00 | (uint)(byte)ref_count[0]);
  pVVar23->swreg15 =
       (anon_struct_4_6_2cf6d189_for_swreg15)
       ((ref_count[0xe] & 1U) << 0xe |
       (ref_count[0xd] & 0xfU) << 0xf |
       (ref_count[9] & 0x7fU) << 0x13 |
       (uint)pVVar23->swreg15 & 0xfc003f00 | (uint)(byte)ref_count[8]);
  uVar100._0_4_ = pVVar23->swreg20;
  uVar100._4_4_ = pVVar23->swreg21;
  uVar86 = CONCAT44(ref_count[0xf] << 0x15,ref_count[7] << 0x15) & (ulong)DAT_0029c2d0 |
           CONCAT44(ref_count[0xc] << 0xe,ref_count[4] << 0xe) & (ulong)DAT_0029c2c0 |
           CONCAT44(ref_count[0xb] << 7,ref_count[3] << 7) & (ulong)DAT_0029c2b0 |
           uVar100 & 0xffc00000ffc00000 | CONCAT44(ref_count[10],ref_count[2]) & 0x7f0000007f;
  pVVar23->swreg20 = (anon_struct_4_6_b76789ed_for_swreg20)(int)uVar86;
  pVVar23->swreg21 = (anon_struct_4_6_034ecb4d_for_swreg21)(int)(uVar86 >> 0x20);
  aVar25._1_3_ = SUB43(pVVar23->swreg16,1);
  aVar25._0_1_ = (undefined1)ref_count[0x10];
  pVVar23->swreg16 = aVar25;
  uVar85 = (ref_count[0x11] & 0x7fU) << 0x13;
  pVVar23->swreg16 = (anon_struct_4_6_2eba39e9_for_swreg16)((uint)aVar25 & 0xfc07ffff | uVar85);
  aVar9 = pVVar23->swreg22;
  uVar66 = (ref_count[0x13] & 0x7fU) << 7;
  uVar92 = (ref_count[0x14] & 0x7fU) << 0xe;
  pVVar23->swreg22 =
       (anon_struct_4_6_6b3e87ec_for_swreg22)
       (uVar92 | uVar66 | (uint)aVar9 & 0xffe00000 | ref_count[0x12] & 0x7fU);
  uVar30 = (ref_count[0x15] & 0xfU) << 0xf;
  pVVar23->swreg16 =
       (anon_struct_4_6_2eba39e9_for_swreg16)((uint)aVar25 & 0xfc007fff | uVar85 | uVar30);
  pVVar23->swreg16 =
       (anon_struct_4_6_2eba39e9_for_swreg16)
       ((uint)aVar25 & 0xfc003fff | uVar85 | uVar30 | (ref_count[0x16] & 1U) << 0xe);
  pVVar23->swreg22 =
       (anon_struct_4_6_6b3e87ec_for_swreg22)
       (uVar92 | uVar66 | (uint)aVar9 & 0xffc00000 | ref_count[0x12] & 0x7fU |
       (ref_count[0x17] & 1U) << 0x15);
  aVar26._1_3_ = SUB43(pVVar23->swreg17,1);
  aVar26._0_1_ = local_91a8;
  pVVar23->swreg17 = aVar26;
  uVar66 = (local_91a4 & 0x7f) << 0x13;
  pVVar23->swreg17 = (anon_struct_4_6_307da249_for_swreg17)((uint)aVar26 & 0xfc07ffff | uVar66);
  aVar10 = pVVar23->swreg23;
  uVar92 = local_91a0 & 0x7f;
  pVVar23->swreg23 = (anon_struct_4_6_8162041a_for_swreg23)((uint)aVar10 & 0xffffff80 | uVar92);
  uVar67 = (local_919c & 0x7f) << 7;
  pVVar23->swreg23 =
       (anon_struct_4_6_8162041a_for_swreg23)((uint)aVar10 & 0xffffc000 | uVar92 | uVar67);
  uVar85 = (local_9198 & 0x7f) << 0xe;
  pVVar23->swreg23 =
       (anon_struct_4_6_8162041a_for_swreg23)((uint)aVar10 & 0xffe00000 | uVar92 | uVar67 | uVar85);
  uVar30 = (local_9194 & 0xf) << 0xf;
  pVVar23->swreg17 =
       (anon_struct_4_6_307da249_for_swreg17)((uint)aVar26 & 0xfc007fff | uVar66 | uVar30);
  pVVar23->swreg17 =
       (anon_struct_4_6_307da249_for_swreg17)
       ((uint)aVar26 & 0xfc003fff | uVar66 | uVar30 | (local_9190 & 1) << 0xe);
  pVVar23->swreg23 =
       (anon_struct_4_6_8162041a_for_swreg23)
       ((uint)aVar10 & 0xffc00000 | uVar92 | uVar67 | uVar85 | (local_918c & 1) << 0x15);
  aVar27._1_3_ = SUB43(pVVar23->swreg18,1);
  aVar27._0_1_ = local_9188;
  pVVar23->swreg18 = aVar27;
  uVar67 = (local_9184 & 0x7f) << 0x13;
  pVVar23->swreg18 = (anon_struct_4_6_a90b2738_for_swreg18)((uint)aVar27 & 0xfc07ffff | uVar67);
  aVar11 = pVVar23->swreg24;
  uVar85 = local_9180 & 0x7f;
  pVVar23->swreg24 = (anon_struct_4_6_8c43d0ff_for_swreg24)((uint)aVar11 & 0xffffff80 | uVar85);
  uVar30 = (local_917c & 0x7f) << 7;
  pVVar23->swreg24 =
       (anon_struct_4_6_8c43d0ff_for_swreg24)((uint)aVar11 & 0xffffc000 | uVar85 | uVar30);
  uVar66 = (local_9178 & 0x7f) << 0xe;
  pVVar23->swreg24 =
       (anon_struct_4_6_8c43d0ff_for_swreg24)((uint)aVar11 & 0xffe00000 | uVar85 | uVar30 | uVar66);
  uVar92 = (local_9174 & 0xf) << 0xf;
  pVVar23->swreg18 =
       (anon_struct_4_6_a90b2738_for_swreg18)((uint)aVar27 & 0xfc007fff | uVar67 | uVar92);
  pVVar23->swreg18 =
       (anon_struct_4_6_a90b2738_for_swreg18)
       ((uint)aVar27 & 0xfc003fff | uVar67 | uVar92 | (local_9170 & 1) << 0xe);
  pVVar23->swreg24 =
       (anon_struct_4_6_8c43d0ff_for_swreg24)
       ((uint)aVar11 & 0xffc00000 | uVar85 | uVar30 | uVar66 | (local_916c & 1) << 0x15);
  aVar28._1_3_ = SUB43(pVVar23->swreg19,1);
  aVar28._0_1_ = local_9168;
  pVVar23->swreg19 = aVar28;
  uVar67 = (local_9164 & 0x7f) << 0x13;
  pVVar23->swreg19 = (anon_struct_4_6_fc300d31_for_swreg19)((uint)aVar28 & 0xfc07ffff | uVar67);
  aVar12 = pVVar23->swreg25;
  uVar85 = local_9160 & 0x7f;
  pVVar23->swreg25 = (anon_struct_4_6_1cc34941_for_swreg25)((uint)aVar12 & 0xffffff80 | uVar85);
  uVar30 = (local_915c & 0x7f) << 7;
  pVVar23->swreg25 =
       (anon_struct_4_6_1cc34941_for_swreg25)((uint)aVar12 & 0xffffc000 | uVar85 | uVar30);
  uVar66 = (local_9158 & 0x7f) << 0xe;
  pVVar23->swreg25 =
       (anon_struct_4_6_1cc34941_for_swreg25)((uint)aVar12 & 0xffe00000 | uVar85 | uVar30 | uVar66);
  uVar92 = (local_9154 & 0xf) << 0xf;
  pVVar23->swreg19 =
       (anon_struct_4_6_fc300d31_for_swreg19)((uint)aVar28 & 0xfc007fff | uVar67 | uVar92);
  pVVar23->swreg19 =
       (anon_struct_4_6_fc300d31_for_swreg19)
       ((uint)aVar28 & 0xfc003fff | uVar67 | uVar92 | (local_9150 & 1) << 0xe);
  pVVar23->swreg25 =
       (anon_struct_4_6_1cc34941_for_swreg25)
       ((uint)aVar12 & 0xffc00000 | uVar85 | uVar30 | uVar66 | (local_914c & 1) << 0x15);
  aVar20._1_3_ = SUB43(pVVar23->swreg31,1);
  aVar20._0_1_ = local_9148;
  pVVar23->swreg31 = aVar20;
  uVar67 = (local_9144 & 0x7f) << 0x13;
  pVVar23->swreg31 = (anon_struct_4_7_653512df_for_swreg31)((uint)aVar20 & 0xfc07ffff | uVar67);
  aVar13 = pVVar23->swreg26;
  uVar85 = local_9140 & 0x7f;
  pVVar23->swreg26 = (anon_struct_4_6_9786faf9_for_swreg26)((uint)aVar13 & 0xffffff80 | uVar85);
  uVar30 = (local_913c & 0x7f) << 7;
  pVVar23->swreg26 =
       (anon_struct_4_6_9786faf9_for_swreg26)((uint)aVar13 & 0xffffc000 | uVar85 | uVar30);
  uVar66 = (local_9138 & 0x7f) << 0xe;
  pVVar23->swreg26 =
       (anon_struct_4_6_9786faf9_for_swreg26)((uint)aVar13 & 0xffe00000 | uVar85 | uVar30 | uVar66);
  uVar92 = (local_9134 & 0xf) << 0xf;
  pVVar23->swreg31 =
       (anon_struct_4_7_653512df_for_swreg31)((uint)aVar20 & 0xfc007fff | uVar67 | uVar92);
  pVVar23->swreg31 =
       (anon_struct_4_7_653512df_for_swreg31)
       ((uint)aVar20 & 0xfc003fff | uVar67 | uVar92 | (local_9130 & 1) << 0xe);
  pVVar23->swreg26 =
       (anon_struct_4_6_9786faf9_for_swreg26)
       ((uint)aVar13 & 0xffc00000 | uVar85 | uVar30 | uVar66 | (local_912c & 1) << 0x15);
  aVar21._1_3_ = SUB43(pVVar23->swreg32,1);
  aVar21._0_1_ = local_9128;
  pVVar23->swreg32 = aVar21;
  uVar66 = (local_9124 & 0x7f) << 0x13;
  pVVar23->swreg32 = (anon_struct_4_7_66f87b3f_for_swreg32)((uint)aVar21 & 0xfc07ffff | uVar66);
  aVar14 = pVVar23->swreg27;
  uVar92 = local_9120 & 0x7f;
  pVVar23->swreg27 = (anon_struct_4_6_a6507eae_for_swreg27)((uint)aVar14 & 0xffffff80 | uVar92);
  uVar67 = (local_911c & 0x7f) << 7;
  pVVar23->swreg27 =
       (anon_struct_4_6_a6507eae_for_swreg27)((uint)aVar14 & 0xffffc000 | uVar92 | uVar67);
  uVar85 = (local_9118 & 0x7f) << 0xe;
  pVVar23->swreg27 =
       (anon_struct_4_6_a6507eae_for_swreg27)((uint)aVar14 & 0xffe00000 | uVar92 | uVar67 | uVar85);
  uVar30 = (local_9114 & 0xf) << 0xf;
  pVVar23->swreg32 =
       (anon_struct_4_7_66f87b3f_for_swreg32)((uint)aVar21 & 0xfc007fff | uVar66 | uVar30);
  pVVar23->swreg32 =
       (anon_struct_4_7_66f87b3f_for_swreg32)
       ((uint)aVar21 & 0xfc003fff | uVar66 | uVar30 | (local_9110 & 1) << 0xe);
  pVVar23->swreg27 =
       (anon_struct_4_6_a6507eae_for_swreg27)
       ((uint)aVar14 & 0xffc00000 | uVar92 | uVar67 | uVar85 | (local_910c & 1) << 0x15);
  lVar76 = *(long *)((long)hal + 0x50);
  lVar89 = *(long *)(lVar76 + 0x1e7a8);
  uVar85 = 0;
  if ((dxva->loop_filter).filter_level[0] == '\0') {
    uVar85 = (uint)((dxva->loop_filter).filter_level[1] == '\0') << 0xe;
  }
  *(uint *)(lVar89 + 0xc) = *(uint *)(lVar89 + 0xc) & 0xffffbfff | uVar85;
  *(uint *)(lVar89 + 0x14) =
       (*(uint *)(lVar89 + 0x14) & 0xfffffffd) +
       (uint)(0x20 < (dxva->loop_filter).filter_level[0]) * 2;
  uVar30 = ((dxva->loop_filter).sharpness_level & 7) << 0x1c;
  uVar85 = *(uint *)(lVar89 + 0x78);
  *(uint *)(lVar89 + 0x78) = uVar85 & 0x8fffffff | uVar30;
  if ((dxva->loop_filter).mode_ref_delta_enabled == '\0') {
    *(uint *)(lVar89 + 0xec) = *(uint *)(lVar89 + 0xec) & 0xf0000000;
    *(uint *)(lVar89 + 0xc4) = *(uint *)(lVar89 + 0xc4) & 0xffffc000;
    uVar30 = uVar85 & 0x80000000 | uVar30;
  }
  else {
    uVar92 = ((byte)(dxva->loop_filter).ref_deltas[0] & 0x7f) << 0x15;
    uVar66 = *(uint *)(lVar89 + 0xec);
    *(uint *)(lVar89 + 0xec) = uVar66 & 0xf01fffff | uVar92;
    uVar67 = ((byte)(dxva->loop_filter).ref_deltas[1] & 0x7f) << 0xe;
    *(uint *)(lVar89 + 0xec) = uVar66 & 0xf0003fff | uVar92 | uVar67;
    uVar68 = ((byte)(dxva->loop_filter).ref_deltas[2] & 0x7f) << 7;
    *(uint *)(lVar89 + 0xec) = uVar66 & 0xf000007f | uVar92 | uVar67 | uVar68;
    *(uint *)(lVar89 + 0xec) =
         uVar66 & 0xf0000000 | uVar92 | uVar67 | uVar68 |
         (byte)(dxva->loop_filter).ref_deltas[3] & 0x7f;
    uVar92 = ((byte)(dxva->loop_filter).ref_deltas[4] & 0x7f) << 7;
    *(uint *)(lVar89 + 0x78) = uVar85 & 0x8fffc07f | uVar30 | uVar92;
    uVar67 = (byte)(dxva->loop_filter).ref_deltas[5] & 0x7f;
    *(uint *)(lVar89 + 0x78) = uVar85 & 0x8fffc000 | uVar30 | uVar92 | uVar67;
    uVar68 = ((byte)(dxva->loop_filter).ref_deltas[6] & 0x7f) << 7;
    uVar66 = *(uint *)(lVar89 + 0xc4);
    *(uint *)(lVar89 + 0xc4) = uVar66 & 0xffffc07f | uVar68;
    *(uint *)(lVar89 + 0xc4) =
         uVar66 & 0xffffc000 | uVar68 | (byte)(dxva->loop_filter).ref_deltas[7] & 0x7f;
    uVar66 = ((byte)(dxva->loop_filter).mode_deltas[0] & 0x7f) << 0x15;
    *(uint *)(lVar89 + 0x78) = uVar85 & 0x801fc000 | uVar30 | uVar92 | uVar67 | uVar66;
    uVar30 = uVar85 & 0x80000000 | uVar30 | uVar92 | uVar67 | uVar66 |
             ((byte)(dxva->loop_filter).mode_deltas[1] & 0x7f) << 0xe;
  }
  *(uint *)(lVar89 + 0x78) = uVar30;
  iVar93 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar76 + 0x58),"vdpu_av1d_set_loopfilter");
  *(int *)(lVar89 + 0x2cc) = iVar93;
  iVar93 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar76 + 0x58),"vdpu_av1d_set_loopfilter");
  *(int *)(lVar89 + 0x2dc) = iVar93;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0xb7,*(RK_U32 *)(lVar76 + 0x74));
  lVar76 = *(long *)(*(long *)((long)hal + 0x50) + 0x1e7a8);
  uVar30 = (uint)dxva->width * 0x10000 + 0x70000 & 0xfff80000;
  uVar85 = *(uint *)(lVar76 + 0x10);
  *(uint *)(lVar76 + 0x10) = uVar85 & 0x7ffff | uVar30;
  *(uint *)(lVar76 + 0x10) = uVar85 & 0x3f | uVar30 | *(int *)&dxva->height * 8 + 0x38U & 0x7ffc0;
  bVar6 = 0;
  uVar30 = (uint)(ushort)-dxva->width << 0x1d;
  uVar85 = *(uint *)(lVar76 + 0x30);
  *(uint *)(lVar76 + 0x30) = uVar85 & 0x1fffffff | uVar30;
  *(uint *)(lVar76 + 0x30) = uVar85 & 0x3ffffff | uVar30 | ((ushort)-dxva->height & 7) << 0x1a;
  *(uint *)(lVar76 + 0x20) = *(uint *)(lVar76 + 0x20) & 0x1ffff | dxva->upscaled_width << 0x11;
  *(uint *)(lVar76 + 0x24) =
       *(uint *)(lVar76 + 0x24) & 0xfffe3fff | (dxva->superres_denom & 7) << 0xe;
  lVar76 = *(long *)((long)hal + 0x50);
  lVar89 = *(long *)(lVar76 + 0x1e7a8);
  uVar90 = SUB168(ZEXT416(0xe),0);
  uVar86 = SUB168(ZEXT416(0x38000),0);
  uVar85 = 0xe000e;
  if (((ulong)dxva->field_10 & 0x400000000) == 0) {
    uVar92 = 0;
  }
  else {
    uVar66 = (*(uint *)(lVar89 + 0x24) >> 0xe & 7) + 9;
    uVar30 = dxva->upscaled_width;
    uVar92 = 0;
    uVar100 = (ulong)((uVar66 >> 1) + uVar30 * 8) / (ulong)uVar66;
    uVar66 = 0x10;
    if (uVar30 < 0x10) {
      uVar66 = uVar30;
    }
    uVar60 = (ulong)uVar66;
    if (uVar66 < (uint)uVar100) {
      uVar60 = uVar100;
    }
    iVar93 = (int)uVar60;
    if (iVar93 - uVar30 != 0) {
      uVar85 = iVar93 + 1U >> 1;
      iVar94 = (int)(uVar30 + 1) >> 1;
      iVar97 = ((int)uVar30 / 2 + iVar93 * 0x4000) / (int)uVar30;
      iVar83 = (int)(CONCAT44((int)(uVar30 + 1) >> 0x1f,iVar94) / 2);
      iVar104 = (int)(iVar83 + uVar85 * 0x4000) / iVar94;
      uVar90 = CONCAT44((int)((uVar85 - iVar94) * 0x2000 + iVar83) / iVar94 + 0x80 +
                        (int)(iVar104 * iVar94 + uVar85 * -0x4000) / -2,iVar104) &
               (ulong)DAT_0029c300;
      uVar85 = (int)((iVar93 + 1U >> 2) + iVar94 * 0x4000) / (int)uVar85 & 0xffffU |
               (int)((int)(uVar60 >> 1) + uVar30 * 0x4000) / iVar93 << 0x10;
      uVar86 = CONCAT44(((int)((iVar93 - uVar30) * 0x2000 + (int)uVar30 / 2) / (int)uVar30 + 0x80 +
                        (int)(iVar97 * uVar30 + iVar93 * -0x4000) / -2) * 0x4000,iVar97 << 0xe) &
               (ulong)DAT_0029c310;
      uVar92 = 0x20000;
    }
  }
  *(uint *)(lVar89 + 0x4a8) = uVar85;
  *(ulong *)(lVar89 + 0xcc) = *(ulong *)(lVar89 + 0xcc) & (ulong)DAT_0029c320 | uVar86 | uVar90;
  *(uint *)(lVar89 + 0x14) = *(uint *)(lVar89 + 0x14) & 0xfffdffff | uVar92;
  iVar93 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar76 + 0x58),"vdpu_av1d_superres_params");
  *(int *)(lVar89 + 0x164) = iVar93;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x59,*(RK_U32 *)(lVar76 + 0x84));
  lVar76 = *(long *)((long)hal + 0x50);
  lVar89 = *(long *)(lVar76 + 0x1e7a8);
  uVar85 = *(uint *)(lVar89 + 0x1c);
  uVar66 = ((dxva->cdef).bits & 3) << 5;
  *(uint *)(lVar89 + 0x1c) = uVar85 & 0xffffff9f | uVar66;
  uVar30._0_1_ = (dxva->cdef).damping;
  uVar30._1_1_ = (dxva->cdef).bits;
  uVar30._2_1_ = (dxva->cdef).y_strengths[0].primary;
  uVar30._3_1_ = (dxva->cdef).y_strengths[0].secondary;
  *(uint *)(lVar89 + 0x1c) = (uVar85 & 0xffffff87 | uVar66) + (uVar30 & 3) * 8;
  lVar88 = 0;
  uVar66 = 0;
  uVar30 = 0;
  uVar85 = 0;
  uVar92 = 0;
  for (lVar96 = 0; (lVar96 != 8 && (lVar96 != 1L << ((dxva->cdef).bits & 0x3f)));
      lVar96 = lVar96 + 1) {
    uVar92 = uVar92 | (uint)(&(dxva->cdef).y_strengths[0].primary)[lVar88] << (bVar6 & 0x1f);
    uVar85 = uVar85 | (uint)(&(dxva->cdef).y_strengths[0].secondary)[lVar88] <<
                      ((byte)lVar88 & 0x1f);
    uVar66 = uVar66 | (uint)(&(dxva->cdef).uv_strengths[0].primary)[lVar88] << (bVar6 & 0x1f);
    uVar30 = uVar30 | (uint)(&(dxva->cdef).uv_strengths[0].secondary)[lVar88] <<
                      ((byte)lVar88 & 0x1f);
    lVar88 = lVar88 + 2;
    bVar6 = bVar6 + 4;
  }
  *(uint *)(lVar89 + 0x41c) = uVar92;
  *(uint *)(lVar89 + 0x420) = uVar66;
  *(uint *)(lVar89 + 0xd4) = uVar30 & 0xffff | uVar85 << 0x10;
  iVar93 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar76 + 0x58),"vdpu_av1d_set_cdef");
  *(int *)(lVar89 + 0x154) = iVar93;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x55,*(RK_U32 *)(lVar76 + 0x7c));
  lVar76 = *(long *)((long)hal + 0x50);
  lVar89 = *(long *)(lVar76 + 0x1e7a8);
  pUVar91 = (dxva->loop_filter).frame_restoration_type;
  uVar30 = 0;
  uVar85 = 0;
  for (lVar88 = 0; lVar88 != 6; lVar88 = lVar88 + 2) {
    uVar30 = uVar30 | (uint)*pUVar91 << ((byte)lVar88 & 0x1f);
    uVar85 = uVar85 | (uint)pUVar91[3] << ((byte)lVar88 & 0x1f);
    pUVar91 = pUVar91 + 1;
  }
  *(uint *)(lVar89 + 0x48) = *(uint *)(lVar89 + 0x48) & 0x3ffffff | uVar30 << 0x1a;
  *(uint *)(lVar89 + 0x4c) = *(uint *)(lVar89 + 0x4c) & 0x3ffffff | uVar85 << 0x1a;
  iVar93 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar76 + 0x58),"vdpu_av1d_set_lr");
  *(int *)(lVar89 + 0x16c) = iVar93;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x5b,*(RK_U32 *)(lVar76 + 0x8c));
  pVVar23 = ctx->regs;
  pvVar58 = mpp_buffer_get_ptr_with_caller(ctx->film_grain_mem,"vdpu_av1d_set_fgs");
  if ((dxva->film_grain).apply_grain != '\0') {
    aVar15 = pVVar23->swreg7;
    uVar85 = (uint)((dxva->film_grain).num_y_points != '\0') << 8;
    pVVar23->swreg7 = (anon_struct_4_14_914205bb_for_swreg7)((uint)aVar15 & 0xfffffeff | uVar85);
    uVar30 = (uint)((dxva->film_grain).num_cb_points != '\0') << 9;
    pVVar23->swreg7 =
         (anon_struct_4_14_914205bb_for_swreg7)((uint)aVar15 & 0xfffffcff | uVar85 | uVar30);
    uVar66 = (uint)((dxva->film_grain).num_cr_points != '\0') << 10;
    pVVar23->swreg7 =
         (anon_struct_4_14_914205bb_for_swreg7)
         ((uint)aVar15 & 0xfffff8ff | uVar85 | uVar30 | uVar66);
    pVVar23->swreg8 =
         (anon_struct_4_6_bb133afb_for_swreg8)
         ((uint)pVVar23->swreg8 & 0xfffffff0 | (dxva->film_grain).scaling_shift_minus8 & 0xf ^ 8);
    if ((dxva->film_grain).chroma_scaling_from_luma == '\0') {
      uVar92 = ((dxva->film_grain).cb_mult ^ 0x80) << 0x11;
      aVar16 = pVVar23->swreg28;
      pVVar23->swreg28 = (anon_struct_4_4_56b39857_for_swreg28)((uint)aVar16 & 0xfe01ffff | uVar92);
      uVar67 = ((dxva->film_grain).cb_luma_mult ^ 0x80) << 9;
      pVVar23->swreg28 =
           (anon_struct_4_4_56b39857_for_swreg28)((uint)aVar16 & 0xfe0001ff | uVar92 | uVar67);
      pVVar23->swreg28 =
           (anon_struct_4_4_56b39857_for_swreg28)
           ((uint)aVar16 & 0xfe000000 | uVar92 | uVar67 |
           (dxva->film_grain).cb_offset & 0x1ff ^ 0x100);
      uVar92 = ((dxva->film_grain).cr_mult ^ 0x80) << 0x11;
      aVar17 = pVVar23->swreg29;
      pVVar23->swreg29 = (anon_struct_4_4_36e9efea_for_swreg29)((uint)aVar17 & 0xfe01ffff | uVar92);
      uVar67 = ((dxva->film_grain).cr_luma_mult ^ 0x80) << 9;
      pVVar23->swreg29 =
           (anon_struct_4_4_36e9efea_for_swreg29)((uint)aVar17 & 0xfe0001ff | uVar92 | uVar67);
      pVVar23->swreg29 =
           (anon_struct_4_4_36e9efea_for_swreg29)
           ((uint)aVar17 & 0xfe000000 | uVar92 | uVar67 |
           (dxva->film_grain).cr_offset & 0x1ff ^ 0x100);
    }
    else {
      uVar60._0_4_ = pVVar23->swreg28;
      uVar60._4_4_ = pVVar23->swreg29;
      uVar86 = uVar60 & (ulong)DAT_0029c330 | (ulong)DAT_0029c340;
      pVVar23->swreg28 = (anon_struct_4_4_56b39857_for_swreg28)(int)uVar86;
      pVVar23->swreg29 = (anon_struct_4_4_36e9efea_for_swreg29)(int)(uVar86 >> 0x20);
    }
    uVar92 = ((dxva->film_grain).overlap_flag & 1) << 0xb;
    pVVar23->swreg7 =
         (anon_struct_4_14_914205bb_for_swreg7)
         ((uint)aVar15 & 0xfffff0ff | uVar85 | uVar30 | uVar66 | uVar92);
    uVar67 = ((dxva->film_grain).clip_to_restricted_range & 1) << 0xc;
    pVVar23->swreg7 =
         (anon_struct_4_14_914205bb_for_swreg7)
         ((uint)aVar15 & 0xffffe0ff | uVar85 | uVar30 | uVar66 | uVar92 | uVar67);
    uVar68 = ((dxva->film_grain).chroma_scaling_from_luma & 1) << 0xd;
    pVVar23->swreg7 =
         (anon_struct_4_14_914205bb_for_swreg7)
         ((uint)aVar15 & 0xffffc0ff | uVar85 | uVar30 | uVar66 | uVar92 | uVar67 | uVar68);
    pVVar23->swreg7 =
         (anon_struct_4_14_914205bb_for_swreg7)
         ((uint)aVar15 & 0xc00000ff | uVar85 | uVar30 | uVar66 | uVar92 | uVar67 | uVar68 |
         (uint)(dxva->film_grain).grain_seed << 0xe);
    scaling_lut = &ctx->fgsmem;
    init_scaling_function
              ((RK_U8 (*) [2])(dxva->film_grain).scaling_points_y,(dxva->film_grain).num_y_points,
               scaling_lut->scaling_lut_y);
    if ((dxva->film_grain).chroma_scaling_from_luma == '\0') {
      init_scaling_function
                ((RK_U8 (*) [2])(dxva->film_grain).scaling_points_cb,
                 (dxva->film_grain).num_cb_points,(ctx->fgsmem).scaling_lut_cb);
      init_scaling_function
                ((RK_U8 (*) [2])(dxva->film_grain).scaling_points_cr,
                 (dxva->film_grain).num_cr_points,(ctx->fgsmem).scaling_lut_cr);
    }
    else {
      memcpy((ctx->fgsmem).scaling_lut_cb,scaling_lut,0x100);
      memcpy((ctx->fgsmem).scaling_lut_cr,scaling_lut,0x100);
    }
    lVar76 = 0;
    do {
      if (lVar76 != 0x18) {
        if (lVar76 == 0x19) goto LAB_0020e46b;
        ar_coeffs_y[lVar76] = (dxva->film_grain).ar_coeffs_y[lVar76] - 0x80;
      }
      refs_selected[lVar76] = (dxva->film_grain).ar_coeffs_cb[lVar76] - 0x80;
      *(uint *)(mf_types + lVar76 * 4) = (dxva->film_grain).ar_coeffs_cr[lVar76] - 0x80;
      lVar76 = lVar76 + 1;
    } while( true );
  }
  *(byte *)&pVVar23->swreg7 = *(byte *)&pVVar23->swreg7 & 0x7f;
LAB_0020e679:
  lVar76 = *(long *)((long)hal + 0x50);
  pvVar58 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar76 + 0x30),"vdpu_av1d_set_prob");
  lVar89 = *(long *)(lVar76 + 0x1e7a8);
  memcpy(pvVar58,dxva->cdfs,0x2fe0);
  if (((dxva->format).frame_type & 0xfd) == 0) {
    memcpy((void *)((long)pvVar58 + 0x890),dxva->cdfs_ndvc,0x8a);
  }
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar76 + 0x30),0,"vdpu_av1d_set_prob");
  iVar93 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar76 + 0x38),"vdpu_av1d_set_prob");
  *(int *)(lVar89 + 0x2ac) = iVar93;
  iVar93 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar76 + 0x30),"vdpu_av1d_set_prob");
  *(int *)(lVar89 + 0x2b4) = iVar93;
  bVar6 = ctx->tile_transpose;
  pVVar23 = ctx->regs;
  uVar4 = (dxva->tiles).context_update_id;
  uVar66 = (uint)uVar4;
  uVar85 = (uint)(dxva->tiles).cols;
  uVar30 = (uint)uVar4 % uVar85;
  uVar92 = (uint)((short)uVar30 == 0) << 0xb;
  aVar101 = pVVar23->swreg11;
  pVVar23->swreg11 = (anon_struct_4_14_b2705f36_for_swreg11)((uint)aVar101 & 0xfffff7ff | uVar92);
  if (bVar6 != 0) {
    uVar66 = (dxva->tiles).rows * uVar30 + uVar4 / uVar85;
  }
  if ((dxva->tiles).cols < 2) {
    local_937c = (uint)(1 < (dxva->tiles).rows) * 2;
  }
  aVar45 = (anon_struct_4_6_c35305d8_for_swreg10)((uint)pVVar23->swreg10 & 0xfffffffd | local_937c);
  pVVar23->swreg10 = aVar45;
  uVar85 = ((dxva->tiles).cols & 0x7f) << 0x11;
  pVVar23->swreg10 = (anon_struct_4_6_c35305d8_for_swreg10)((uint)aVar45 & 0xff01ffff | uVar85);
  uVar4 = (dxva->tiles).rows;
  pVVar23->swreg9 =
       (anon_struct_4_10_545f55a1_for_swreg9)((uint)pVVar23->swreg9 & 0xfffff | uVar66 << 0x14);
  pVVar23->swreg10 =
       (anon_struct_4_6_c35305d8_for_swreg10)
       (bVar6 & 1 | (uint)aVar45 & 0xff0003fe | uVar85 | (uVar4 & 0x7f) << 10);
  pVVar23->swreg11 =
       (anon_struct_4_14_b2705f36_for_swreg11)
       ((uint)aVar101 & 0x3ffff7ff | uVar92 | *(int *)&(dxva->tiles).tile_sz_mag << 0x1e);
  if ((local_937c != 0) && (((byte)hal_av1d_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_av1d_vdpu","NOTICE: tile enabled.\n",(char *)0x0);
  }
  aVar46 = (anon_struct_4_1_1bae43a1_for_swreg167)
           mpp_buffer_get_fd_with_caller(ctx->tile_info,"vdpu_av1d_set_tile_info_regs");
  pHVar62 = local_9350;
  (pVVar23->addr_cfg).swreg167 = aVar46;
  (pVVar23->addr_cfg).swreg166 = (anon_struct_4_1_1bae4762_for_swreg166)0x0;
  aVar15 = __s->swreg7;
  uVar85 = ((dxva->format).mono_chrome & 1) << 0x1e;
  __s->swreg7 = (anon_struct_4_14_914205bb_for_swreg7)((uint)aVar15 & 0xbfffffff | uVar85);
  uVar30 = ((dxva->film_grain).clip_to_restricted_range & 1) << 0xc;
  __s->swreg7 = (anon_struct_4_14_914205bb_for_swreg7)((uint)aVar15 & 0xbfffefff | uVar85 | uVar30);
  aVar15 = (anon_struct_4_14_914205bb_for_swreg7)
           (((uint)aVar15 & 0xbfffeff9 | uVar85 | uVar30) +
           ((dxva->quantization).delta_q_res & 3) * 2);
  __s->swreg7 = aVar15;
  __s->swreg7 = (anon_struct_4_14_914205bb_for_swreg7)
                ((uint)aVar15 & 0xfffffffe | (dxva->quantization).delta_q_present & 1);
  uVar85 = (uint)((dxva->format).frame_type == '\0') << 0x10;
  aVar18 = __s->swreg8;
  __s->swreg8 = (anon_struct_4_6_bb133afb_for_swreg8)((uint)aVar18 & 0xfffeffff | uVar85);
  uVar30 = (uint)(dxva->quantization).base_qindex << 8;
  __s->swreg8 = (anon_struct_4_6_bb133afb_for_swreg8)((uint)aVar18 & 0xfffe00ff | uVar85 | uVar30);
  uVar66 = (dxva->bitdepth & 3) << 6;
  __s->swreg8 = (anon_struct_4_6_bb133afb_for_swreg8)
                ((uint)aVar18 & 0xfffe003f | uVar85 | uVar30 | uVar66);
  __s->swreg8 = (anon_struct_4_6_bb133afb_for_swreg8)
                ((uint)aVar18 & 0xfffe000f | uVar85 | uVar30 | uVar66 | (dxva->bitdepth & 3) << 4);
  uVar30 = (dxva->interp_filter & 7) << 8;
  aVar101 = __s->swreg11;
  __s->swreg11 = (anon_struct_4_14_b2705f36_for_swreg11)((uint)aVar101 & 0xfffff8ff | uVar30);
  uVar66 = *(uint *)&dxva->field_10 >> 0x13 & 0x80;
  __s->swreg11 = (anon_struct_4_14_b2705f36_for_swreg11)
                 ((uint)aVar101 & 0xfffff87f | uVar30 | uVar66);
  uVar92 = *(uint *)&dxva->field_10 >> 0x1a & 0xffffffe0;
  __s->swreg11 = (anon_struct_4_14_b2705f36_for_swreg11)
                 ((uint)aVar101 & 0xfffff84f | uVar30 | uVar66 | uVar92);
  uVar67 = SUB84(dxva->field_10,4) >> 3;
  uVar85 = uVar67 * 0x8000000 + 0x10000000 & 0x38000000;
  if ((uVar67 & 7) == 0) {
    uVar85 = 0;
  }
  __s->swreg11 = (anon_struct_4_14_b2705f36_for_swreg11)
                 ((uint)aVar101 & 0xc7fff84f | uVar30 | uVar66 | uVar92 | uVar85);
  __s->swreg12 = (anon_struct_4_8_66c0642b_for_swreg12)
                 ((*(ushort *)&dxva->field_10 >> 2 & 0x400) + ((uint)__s->swreg12 & 0xfff803ff) +
                 0x7800);
  aVar19 = __s->swreg13;
  __s->swreg13 = (anon_struct_4_10_0fd9c99d_for_swreg13)((uint)aVar19 & 0xfffffe07);
  __s->swreg14 = (anon_struct_4_6_2b336929_for_swreg14)((uint)__s->swreg14 & 0xffffc0ff);
  __s->swreg15 = (anon_struct_4_6_2cf6d189_for_swreg15)((uint)__s->swreg15 & 0xffffc0ff);
  __s->swreg16 = (anon_struct_4_6_2eba39e9_for_swreg16)((uint)__s->swreg16 & 0xffffc0ff);
  __s->swreg17 = (anon_struct_4_6_307da249_for_swreg17)((uint)__s->swreg17 & 0xffffc0ff);
  uVar80._0_4_ = __s->swreg18;
  uVar80._4_4_ = __s->swreg19;
  __s->swreg18 = (anon_struct_4_6_a90b2738_for_swreg18)(int)(uVar80 & 0xffffc0ffffffc0ff);
  __s->swreg19 = (anon_struct_4_6_fc300d31_for_swreg19)(int)((uVar80 & 0xffffc0ffffffc0ff) >> 0x20);
  aVar20 = __s->swreg31;
  __s->swreg31 = (anon_struct_4_7_653512df_for_swreg31)((uint)aVar20 & 0xffffc0ff);
  aVar21 = __s->swreg32;
  __s->swreg32 = (anon_struct_4_7_66f87b3f_for_swreg32)((uint)aVar21 & 0xffffc0ff);
  uVar85 = (uint)(byte)(dxva->quantization).y_dc_delta_q << 0x19;
  __s->swreg13 = (anon_struct_4_10_0fd9c99d_for_swreg13)((uint)aVar19 & 0x1fffe07 | uVar85);
  uVar30 = ((byte)(dxva->quantization).u_dc_delta_q & 0x7f) << 0x12;
  __s->swreg13 = (anon_struct_4_10_0fd9c99d_for_swreg13)((uint)aVar19 & 0x3fe07 | uVar85 | uVar30);
  uVar66 = ((byte)(dxva->quantization).u_ac_delta_q & 0x7f) << 0xb;
  __s->swreg13 = (anon_struct_4_10_0fd9c99d_for_swreg13)
                 ((uint)aVar19 & 0x607 | uVar85 | uVar30 | uVar66);
  __s->swreg47 = (anon_struct_4_5_8bdbaba8_for_swreg47)
                 ((uint)__s->swreg47 & 0x87ffffff | ((dxva->quantization).qm_y & 0xf) << 0x1b);
  __s->swreg48 = (anon_struct_4_5_5cd422b8_for_swreg48)
                 ((uint)__s->swreg48 & 0x87ffffff | ((dxva->quantization).qm_u & 0xf) << 0x1b);
  __s->swreg49 = (anon_struct_4_4_ee14b1da_for_swreg49)
                 ((uint)__s->swreg49 & 0xfffc3fff | ((dxva->quantization).qm_v & 0xf) << 0xe);
  __s->swreg13 = (anon_struct_4_10_0fd9c99d_for_swreg13)
                 ((uint)aVar19 & 0x407 | uVar85 | uVar30 | uVar66 | (dxva->coded_lossless & 1) << 9)
  ;
  __s->swreg28 = (anon_struct_4_4_56b39857_for_swreg28)
                 ((uint)__s->swreg28 & 0x1ffffff |
                 (uint)(byte)(dxva->quantization).v_dc_delta_q << 0x19);
  __s->swreg29 = (anon_struct_4_4_36e9efea_for_swreg29)
                 ((uint)__s->swreg29 & 0x1ffffff |
                 (uint)(byte)(dxva->quantization).v_ac_delta_q << 0x19);
  uVar85 = (dxva->skip_ref0 & 0xf) << 0x1a;
  if (dxva->skip_ref0 == 0) {
    uVar85 = 0x4000000;
  }
  __s->swreg31 = (anon_struct_4_7_653512df_for_swreg31)((uint)aVar20 & 0xc3ffc0ff | uVar85);
  uVar85 = (dxva->skip_ref1 & 0xf) << 0x1a;
  if (dxva->skip_ref1 == 0) {
    uVar85 = 0x4000000;
  }
  __s->swreg32 = (anon_struct_4_7_66f87b3f_for_swreg32)((uint)aVar21 & 0xc3ffc0ff | uVar85);
  uVar85 = ctx->luma_size;
  uVar30 = dxva->frame_tag_size & 0xfffffff0;
  aVar47 = (anon_struct_4_1_4038c17b_for_swreg65)
           mpp_buffer_get_fd_with_caller(*local_9350->buf,"vdpu_av1d_gen_regs");
  (__s->addr_cfg).swreg65 = aVar47;
  aVar48 = (anon_struct_4_1_82573765_for_swreg99)
           mpp_buffer_get_fd_with_caller(*pHVar62->buf,"vdpu_av1d_gen_regs");
  (__s->addr_cfg).swreg99 = aVar48;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),99,uVar85);
  aVar49 = (anon_struct_4_1_169ba666_for_swreg133)
           mpp_buffer_get_fd_with_caller(*pHVar62->buf,"vdpu_av1d_gen_regs");
  (__s->addr_cfg).swreg133 = aVar49;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x85,(uVar85 >> 1) + uVar85 + 0x40);
  __s->swreg258 =
       (anon_struct_4_1_a6cf583c_for_swreg258)(*(int *)((long)hal + 0x10) + 0x7fU & 0xffffff80);
  __s->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)
                ((uint)__s->swreg5 & 0x1ffffff | dxva->frame_tag_size << 0x1c);
  __s->swreg6 = (anon_struct_4_1_a31bdfb1_for_swreg6)
                (*(int *)((long)hal + 0x10) + 0x7fU & 0xffffff80);
  __s->swreg259 = (anon_struct_4_1_901bd7f6_for_swreg259)0x0;
  (__s->addr_cfg).swreg168 = (anon_struct_4_1_c37ab5d0_for_swreg168)0x0;
  aVar50 = (anon_struct_4_1_c37ab20f_for_swreg169)
           mpp_buffer_get_fd_with_caller(streambuf,"vdpu_av1d_gen_regs");
  (__s->addr_cfg).swreg169 = aVar50;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0xa9,uVar30);
  if ((((((byte)hal_av1d_debug & 8) != 0) &&
       (_mpp_log_l(4,"hal_av1d_vdpu","stream len %d\n",(char *)0x0,
                   (ulong)*(uint *)((long)hal + 0x10)), ((byte)hal_av1d_debug & 8) != 0)) &&
      (_mpp_log_l(4,"hal_av1d_vdpu","stream offset %d\n",(char *)0x0,(ulong)uVar30),
      ((byte)hal_av1d_debug & 8) != 0)) &&
     (_mpp_log_l(4,"hal_av1d_vdpu","stream tag_size %d\n",(char *)0x0,(ulong)dxva->frame_tag_size),
     ((byte)hal_av1d_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_av1d_vdpu","stream start_bit %d\n",(char *)0x0,
               (ulong)((uint)__s->swreg5 >> 0x19));
  }
  *(undefined2 *)&__s->swreg314 = 0x40;
  aVar51 = (anon_struct_4_1_4e3bf742_for_swreg175)
           mpp_buffer_get_fd_with_caller(ctx->tile_buf,"vdpu_av1d_gen_regs");
  (__s->addr_cfg).swreg175 = aVar51;
  aVar52 = (anon_struct_4_1_23975d0d_for_swreg177)
           mpp_buffer_get_fd_with_caller(ctx->tile_buf,"vdpu_av1d_gen_regs");
  (__s->addr_cfg).swreg177 = aVar52;
  __s->swreg55 = (anon_struct_4_4_c9f88b99_for_swreg55)((uint)__s->swreg55 & 0x7fff0000 | 8);
  uVar85 = (uint)__s->swreg58 & 0xfffff800;
  __s->swreg58 = (anon_struct_4_9_1a5abba5_for_swreg58)(uVar85 + 0x210);
  puVar77 = &(__s->swreg266).field_0x3;
  *puVar77 = *puVar77 & 0xbf;
  __s->swreg265 =
       (anon_struct_4_6_3955e65b_for_swreg265)((uint)__s->swreg265 & 0xf00000ff | 0x1004000);
  __s->swreg318 = (anon_struct_4_2_4fb738c6_for_swreg318)0x8fffffff;
  __s->swreg319 = (anon_struct_4_2_b6465c06_for_swreg319)0x8fffffff;
  aVar22 = (__s->vdpu_av1d_pp_cfg).swreg320;
  (__s->vdpu_av1d_pp_cfg).swreg320 = (anon_struct_4_11_260badcd_for_swreg320)((uint)aVar22 | 1);
  puVar77 = &(__s->vdpu_av1d_pp_cfg).swreg322.field_0x3;
  *puVar77 = *puVar77 & 7;
  *(undefined2 *)&(__s->vdpu_av1d_pp_cfg).swreg394.field_0x2 = 0x101;
  uVar30 = (uint)local_9360;
  (__s->vdpu_av1d_pp_cfg).swreg331 =
       (anon_struct_4_2_1423c012_for_swreg331)((uVar30 & 0xfffe) << 0xf | local_9364 >> 1);
  (__s->vdpu_av1d_pp_cfg).swreg332 =
       (anon_struct_4_2_35d84258_for_swreg332)(uVar30 << 0x10 | local_9364);
  (__s->vdpu_av1d_pp_cfg).swreg329 =
       (anon_struct_4_2_bc7a340b_for_swreg329)((local_9368 & 0xffff) * 0x10001);
  if (ctx->fbc_en == '\0') {
    RVar32 = local_936c * local_9368;
    MVar34 = mpp_frame_get_fmt(mframe);
    uVar85 = 0xc0000;
    if ((MVar34 & 0xfffff) != MPP_FMT_YUV420SP) {
      uVar85 = 0;
    }
    (__s->vdpu_av1d_pp_cfg).swreg322 =
         (anon_struct_4_5_aa102880_for_swreg322)
         ((uint)(__s->vdpu_av1d_pp_cfg).swreg322 & 0xff83ffff | uVar85);
    aVar53 = (anon_struct_4_1_111c466e_for_swreg326)
             mpp_buffer_get_fd_with_caller(buffer,"vdpu_av1d_gen_regs");
    (__s->vdpu_av1d_pp_cfg).swreg326 = aVar53;
    aVar54 = (anon_struct_4_1_6d573f12_for_swreg328)
             mpp_buffer_get_fd_with_caller(buffer,"vdpu_av1d_gen_regs");
    (__s->vdpu_av1d_pp_cfg).swreg328 = aVar54;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x148,RVar32);
  }
  else {
    RVar32 = 8;
    if ((((*(ushort *)&(__s->swreg5).field_0x1 & 0x240) == 0) && ((uint)__s->swreg14 < 0x4000000))
       && ((uint)__s->swreg15 < 0x4000000)) {
      RVar32 = (uint)(0x3ffffff < (uint)__s->swreg18) << 3;
    }
    uVar66 = uVar30;
    if (8 < dxva->bitdepth) {
      uVar66 = uVar30 * 2;
    }
    (__s->vdpu_av1d_pp_cfg).swreg329 =
         (anon_struct_4_2_bc7a340b_for_swreg329)(local_9368 & 0xffff | uVar66 << 0x10);
    uVar92 = uVar30 * 2;
    if (dxva->bitdepth < 9) {
      uVar92 = uVar30;
    }
    (__s->vdpu_av1d_pp_cfg).swreg329 =
         (anon_struct_4_2_bc7a340b_for_swreg329)(uVar92 & 0xffff | uVar66 << 0x10);
    __s->swreg58 = (anon_struct_4_9_1a5abba5_for_swreg58)(uVar85 | 0x6210);
    (__s->vdpu_av1d_pp_cfg).swreg320 = (anon_struct_4_11_260badcd_for_swreg320)((uint)aVar22 | 9);
    uVar85 = uVar30 * -0x10000000;
    if ((local_9360 & 0xf) == 0) {
      uVar85 = uVar30 & 0xf;
    }
    uVar92 = local_9364 + RVar32;
    uVar66 = uVar92 & 0xf;
    uVar30 = 0x10 - uVar66;
    if (uVar66 == 0) {
      uVar30 = 0;
    }
    (__s->vdpu_av1d_pp_cfg).swreg321 =
         (anon_struct_4_7_294d6117_for_swreg321)
         ((uint)(__s->vdpu_av1d_pp_cfg).swreg321 & 0xfffff9ff | 0x400);
    (__s->vdpu_av1d_pp_cfg).swreg503 =
         (anon_struct_4_8_2410b66b_for_swreg503)
         ((uVar30 & 0xf) << 0x18 |
          RVar32 << 0x10 | (uint)*(ushort *)&(__s->vdpu_av1d_pp_cfg).swreg503 | uVar85);
    mpp_frame_set_offset_y(mframe,RVar32);
    mpp_frame_set_ver_stride(mframe,uVar30 + uVar92);
    puVar77 = &(__s->vdpu_av1d_pp_cfg).swreg322.field_0x2;
    *puVar77 = *puVar77 & 0x83;
    aVar53 = (anon_struct_4_1_111c466e_for_swreg326)
             mpp_buffer_get_fd_with_caller(buffer,"vdpu_av1d_gen_regs");
    (__s->vdpu_av1d_pp_cfg).swreg326 = aVar53;
    aVar54 = (anon_struct_4_1_6d573f12_for_swreg328)
             mpp_buffer_get_fd_with_caller(buffer,"vdpu_av1d_gen_regs");
    (__s->vdpu_av1d_pp_cfg).swreg328 = aVar54;
    aVar55 = (anon_struct_4_1_37abd1af_for_swreg505)
             mpp_buffer_get_fd_with_caller(buffer,"vdpu_av1d_gen_regs");
    (__s->vdpu_av1d_pp_cfg).swreg505 = aVar55;
  }
  return MPP_OK;
LAB_0020e46b:
  bVar6 = (dxva->film_grain).ar_coeff_lag;
  iVar83 = (dxva->film_grain).ar_coeff_shift_minus6 + 6;
  uVar4 = dxva->bitdepth;
  bVar65 = (char)uVar4 - 8;
  uVar85 = 0x80 << (bVar65 & 0x1f);
  bVar78 = (dxva->film_grain).grain_scale_shift;
  iVar104 = -uVar85;
  iVar93 = ~uVar85 + (0x100 << (bVar65 & 0x1f));
  GenerateLumaGrainBlock
            ((RK_S32 (*) [82])ref_count,(uint)uVar4,(dxva->film_grain).num_y_points,(uint)bVar78,
             (uint)bVar6,ar_coeffs_y,iVar83,iVar104,iVar93,(dxva->film_grain).grain_seed);
  GenerateChromaGrainBlock
            ((RK_S32 (*) [82])ref_count,(RK_S32 (*) [44])cur_offset,(RK_S32 (*) [44])local_1a58,
             (uint)uVar4,(dxva->film_grain).num_y_points,(dxva->film_grain).num_cb_points,
             (dxva->film_grain).num_cr_points,(uint)bVar78,(uint)bVar6,refs_selected,
             (RK_S32 *)mf_types,iVar83,iVar104,iVar93,(dxva->film_grain).chroma_scaling_from_luma,
             (dxva->film_grain).grain_seed);
  pRVar63 = (ctx->fgsmem).cropped_luma_grain_block;
  puVar77 = local_865c;
  for (lVar76 = 0; lVar76 != 0x40; lVar76 = lVar76 + 1) {
    for (lVar89 = 0; lVar89 != 0x40; lVar89 = lVar89 + 1) {
      pRVar63[lVar89] = *(RK_S16 *)(puVar77 + lVar89 * 4);
    }
    pRVar63 = pRVar63 + 0x40;
    puVar77 = puVar77 + 0x148;
  }
  pRVar63 = (ctx->fgsmem).cropped_chroma_grain_block + 1;
  puVar77 = local_1620;
  puVar99 = local_3040;
  for (lVar76 = 0; lVar76 != 0x20; lVar76 = lVar76 + 1) {
    for (lVar89 = 0; lVar89 != 0x20; lVar89 = lVar89 + 1) {
      pRVar63[lVar89 * 2 + -1] = *(RK_S16 *)(puVar99 + lVar89 * 4);
      pRVar63[lVar89 * 2] = *(RK_S16 *)(puVar77 + lVar89 * 4);
    }
    pRVar63 = pRVar63 + 0x40;
    puVar77 = puVar77 + 0xb0;
    puVar99 = puVar99 + 0xb0;
  }
  memcpy(pvVar58,scaling_lut,0x3300);
  mpp_buffer_sync_end_f(ctx->film_grain_mem,0,"vdpu_av1d_set_fgs");
  (pVVar23->addr_cfg).swreg94 = (anon_struct_4_1_5b01d9b1_for_swreg94)0x0;
  aVar44 = (anon_struct_4_1_5b01d5f0_for_swreg95)
           mpp_buffer_get_fd_with_caller(ctx->film_grain_mem,"vdpu_av1d_set_fgs");
  (pVVar23->addr_cfg).swreg95 = aVar44;
  if ((((uint)pVVar23->swreg7 & 0x80) != 0) && (((byte)hal_av1d_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_av1d_vdpu","NOTICE: filmgrain enabled.\n",(char *)0x0);
  }
  goto LAB_0020e679;
}

Assistant:

MPP_RET vdpu_av1d_gen_regs(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    Av1dHalCtx *p_hal = (Av1dHalCtx *)hal;
    VdpuAv1dRegCtx *ctx = (VdpuAv1dRegCtx *)p_hal->reg_ctx;
    VdpuAv1dRegSet *regs;
    DXVA_PicParams_AV1 *dxva = (DXVA_PicParams_AV1*)task->dec.syntax.data;
    MppFrame mframe;
    MppBuffer buffer = NULL;
    MppBuffer streambuf = NULL;
    RK_U32 height = dxva->height;
    RK_U32 width = dxva->width;
    RK_U32 hor_stride;
    RK_U32 ver_stride;
    HalBuf *tile_out_buf;
    RK_U32 num_tile_cols = 1 << dxva->tile_cols_log2;

    INP_CHECK(ret, NULL == p_hal);

    ctx->refresh_frame_flags = dxva->refresh_frame_flags;

    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err) {
        mpp_err_f("parse err %d ref err %d\n",
                  task->dec.flags.parse_err, task->dec.flags.ref_err);
        goto __RETURN;
    }

    if (p_hal->fast_mode) {
        RK_U32 i = 0;

        for (i = 0; i <  MPP_ARRAY_ELEMS(ctx->reg_buf); i++) {
            if (!ctx->reg_buf[i].valid) {
                task->dec.reg_index = i;
                ctx->regs = ctx->reg_buf[i].regs;
                ctx->reg_buf[i].valid = 1;
                break;
            }
        }
    }

    regs = ctx->regs;
    memset(regs, 0, sizeof(*regs));

    vdpu_av1d_setup_tile_bufs(p_hal, dxva);

    if (!ctx->filter_mem || height > ctx->height || num_tile_cols > ctx->num_tile_cols) {
        if (ctx->filter_mem)
            vdpu_av1d_filtermem_release(ctx);
        ret = vdpu_av1d_filtermem_alloc(p_hal, ctx, dxva);
        if (!ret) {
            mpp_err("filt buffer get fail\n");
            vdpu_av1d_filtermem_release(ctx);
        }
    }

    ctx->width = width;
    ctx->height = height;
    ctx->num_tile_cols = num_tile_cols;
    mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_FRAME_PTR, &mframe);
    mpp_buf_slot_get_prop(p_hal ->slots, task->dec.output, SLOT_BUFFER, &buffer);
    mpp_buf_slot_get_prop(p_hal ->packet_slots, task->dec.input, SLOT_BUFFER, &streambuf);
    tile_out_buf = hal_bufs_get_buf(ctx->tile_out_bufs, task->dec.output);
    hor_stride = mpp_frame_get_hor_stride(mframe);
    ver_stride = mpp_frame_get_ver_stride(mframe);

    ctx->ver_stride = ver_stride;

    p_hal->strm_len = (RK_S32)mpp_packet_get_length(task->dec.input_packet);

    ctx->fbc_en = !!MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe));

    AV1D_DBG(AV1D_DBG_LOG, "bitdepth %d fmt %d [%d : %d] wxh [%d : %d] uxv [%d : %d]\n",
             dxva->bitdepth, mpp_frame_get_fmt(mframe),
             dxva->format.subsampling_x, dxva->format.subsampling_y,
             ctx->width, ctx->height,
             ctx->hor_stride, ctx->ver_stride);

    regs->swreg1.sw_dec_abort_e     = 0;
    regs->swreg1.sw_dec_e           = 1;
    regs->swreg1.sw_dec_tile_int_e  = 0;
    regs->swreg2.sw_dec_clk_gate_e = 1;

    regs->swreg3.sw_dec_mode           = 17; // av1 mode
    regs->swreg3.sw_skip_mode          = dxva->coding.skip_mode;
    regs->swreg3.sw_dec_out_ec_byte_word = 0; // word align
    regs->swreg3.sw_write_mvs_e        = 1;
    regs->swreg3.sw_dec_out_ec_bypass  = 1;

    regs->swreg5.sw_tempor_mvp_e        = dxva->coding.use_ref_frame_mvs;
    regs->swreg5.sw_delta_lf_res_log    = dxva->loop_filter.delta_lf_res;
    regs->swreg5.sw_delta_lf_multi      = dxva->loop_filter.delta_lf_multi;
    regs->swreg5.sw_delta_lf_present    = dxva->loop_filter.delta_lf_present;
    regs->swreg5.sw_disable_cdf_update  = dxva->coding.disable_cdf_update;
    regs->swreg5.sw_allow_warp          = dxva->coding.warped_motion;
    regs->swreg5.sw_show_frame          = dxva->format.show_frame;
    regs->swreg5.sw_switchable_motion_mode  = dxva->coding.switchable_motion_mode;
    regs->swreg5.sw_enable_cdef         = !(dxva->cdef.bits == 0 && dxva->cdef.damping == 0 &&
                                            dxva->cdef.y_strengths[0].primary == 0 &&
                                            dxva->cdef.y_strengths[0].secondary == 0 &&
                                            dxva->cdef.uv_strengths[0].primary == 0 &&
                                            dxva->cdef.uv_strengths[0].secondary == 0);
    regs->swreg5.sw_allow_masked_compound   = dxva->coding.masked_compound;
    regs->swreg5.sw_allow_interintra    = dxva->coding.interintra_compound;
    regs->swreg5.sw_enable_intra_edge_filter = dxva->coding.intra_edge_filter;
    regs->swreg5.sw_allow_filter_intra  = dxva->coding.filter_intra;
    regs->swreg5.sw_enable_jnt_comp     = dxva->coding.jnt_comp;
    regs->swreg5.sw_enable_dual_filter  = dxva->coding.dual_filter;
    regs->swreg5.sw_reduced_tx_set_used = dxva->coding.reduced_tx_set;
    regs->swreg5.sw_allow_screen_content_tools = dxva->coding.screen_content_tools;
    regs->swreg5.sw_allow_intrabc       = dxva->coding.intrabc;

    regs->swreg5.sw_force_interger_mv   = dxva->coding.integer_mv;

    vdpu_av1d_set_global_model(p_hal, dxva);
    vdpu_av1d_set_tile_info_mem(p_hal, dxva);

    if ((dxva->format.frame_type && (dxva->format.frame_type != AV1_FRAME_INTRA_ONLY))
        || dxva->coding.intrabc) {
        vdpu_av1d_set_reference_frames(p_hal, ctx, dxva);
    }
    vdpu_av1d_set_segmentation(ctx, dxva);
    vdpu_av1d_set_loopfilter(p_hal, dxva);
    vdpu_av1d_set_picture_dimensions(p_hal, dxva);
    vdpu_av1d_set_cdef(p_hal, dxva);
    vdpu_av1d_set_lr(p_hal, dxva);
    vdpu_av1d_set_fgs(ctx, dxva);
    vdpu_av1d_set_prob(p_hal, dxva);
    vdpu_av1d_set_tile_info_regs(ctx, dxva);

#if DUMP_AV1_DATAS/* dump buffer */
    {
        char name[128];
        char *path = "/data/video";
        static int g_frame_num = 0;
        FILE *fp;
        RK_U32 i;
        RK_U32 *data;
        RK_U32 size;

        data = mpp_buffer_get_ptr(ctx->global_model);
        size = MPP_ALIGN(GLOBAL_MODEL_SIZE, 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/global_mode_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->tile_info);
        size = AV1_TILE_INFO_SIZE;
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/tile_info_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(streambuf);
        size = MPP_ALIGN(p_hal->strm_len, 1);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/stream_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        fwrite((RK_U8*)data, 1, size, fp);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->film_grain_mem);
        size = MPP_ALIGN(sizeof(AV1FilmGrainMemory), 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/film_grain_mem_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->prob_tbl_base);
        size = MPP_ALIGN(sizeof(AV1CDFs), 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/prob_tbl_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->prob_tbl_out_base);
        size = MPP_ALIGN(sizeof(AV1CDFs), 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/prob_tbl_out_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        g_frame_num ++;
    }
#endif

    regs->swreg7.sw_blackwhite_e    = dxva->format.mono_chrome;
    regs->swreg7.sw_clip_to_restricted_range  = dxva->film_grain.clip_to_restricted_range;
    regs->swreg7.sw_delta_q_res_log     = dxva->quantization.delta_q_res;
    regs->swreg7.sw_delta_q_present     = dxva->quantization.delta_q_present;

    regs->swreg8.sw_idr_pic_e           = !dxva->format.frame_type;
    regs->swreg8.sw_quant_base_qindex   = dxva->quantization.base_qindex;
    regs->swreg8.sw_bit_depth_y_minus8  = dxva->bitdepth - 8;
    regs->swreg8.sw_bit_depth_c_minus8  = dxva->bitdepth - 8;

    regs->swreg11.sw_mcomp_filt_type    = dxva->interp_filter;
    regs->swreg11.sw_high_prec_mv_e     = dxva->coding.high_precision_mv;
    regs->swreg11.sw_comp_pred_mode     = dxva->coding.reference_mode ? 2 : 0;
    regs->swreg11.sw_transform_mode     = dxva->coding.tx_mode ? (dxva->coding.tx_mode + 2) : 0;
    regs->swreg12.sw_max_cb_size        = dxva->coding.use_128x128_superblock ? 7 : 6;;
    regs->swreg12.sw_min_cb_size        = 3;

    /* unused in comdel */
    regs->swreg12.sw_av1_comp_pred_fixed_ref    = 0;
    regs->swreg13.sw_comp_pred_var_ref0_av1     = 0;
    regs->swreg13.sw_comp_pred_var_ref1_av1     = 0;
    regs->swreg14.sw_filt_level_seg0            = 0;
    regs->swreg15.sw_filt_level_seg1            = 0;
    regs->swreg16.sw_filt_level_seg2            = 0;
    regs->swreg17.sw_filt_level_seg3            = 0;
    regs->swreg18.sw_filt_level_seg4            = 0;
    regs->swreg19.sw_filt_level_seg5            = 0;
    regs->swreg31.sw_filt_level_seg6            = 0;
    regs->swreg32.sw_filt_level_seg7            = 0;


    regs->swreg13.sw_qp_delta_y_dc_av1          = dxva->quantization.y_dc_delta_q;
    regs->swreg13.sw_qp_delta_ch_dc_av1         = dxva->quantization.u_dc_delta_q;
    regs->swreg13.sw_qp_delta_ch_ac_av1         = dxva->quantization.u_ac_delta_q;
    regs->swreg47.sw_qmlevel_y                  = dxva->quantization.qm_y;
    regs->swreg48.sw_qmlevel_u                  = dxva->quantization.qm_u;
    regs->swreg49.sw_qmlevel_v                  = dxva->quantization.qm_v;

    regs->swreg13.sw_lossless_e                 = dxva->coded_lossless;
    regs->swreg28.sw_quant_delta_v_dc           = dxva->quantization.v_dc_delta_q;
    regs->swreg29.sw_quant_delta_v_ac           = dxva->quantization.v_ac_delta_q;

    regs->swreg31.sw_skip_ref0              = dxva->skip_ref0 ? dxva->skip_ref0 : 1;
    regs->swreg32.sw_skip_ref1              = dxva->skip_ref1 ? dxva->skip_ref1 : 1;

    /*input out put buf cfg*/
    {
        // RK_U32 out_w = MPP_ALIGN(4 * width * bit_depth, 128) / 8;
        // RK_U32 out_h = height / 4;
        // RK_U32 y_stride = out_w * out_h;
        // RK_U32 uv_stride = y_stride / 2;

        RK_U32 y_stride = ctx->luma_size;
        RK_U32 uv_stride = y_stride / 2;
        RK_U32 mv_offset = y_stride + uv_stride + 64;
        RK_U32 offset = (dxva->frame_tag_size & (~0xf));

        regs->addr_cfg.swreg65.sw_dec_out_ybase_lsb = mpp_buffer_get_fd(tile_out_buf->buf[0]);//mpp_buffer_get_fd(buffer);
        regs->addr_cfg.swreg99.sw_dec_out_cbase_lsb = mpp_buffer_get_fd(tile_out_buf->buf[0]);
        mpp_dev_set_reg_offset(p_hal->dev, 99, y_stride);
        regs->addr_cfg.swreg133.sw_dec_out_dbase_lsb = mpp_buffer_get_fd(tile_out_buf->buf[0]);
        mpp_dev_set_reg_offset(p_hal->dev, 133, mv_offset);

        /*  if (ctx->fbc_en) {
              regs->swreg190.sw_dec_out_tybase_lsb = 0;// TODO:
              regs->swreg224.sw_dec_out_tcbase_lsb = 0;// TODO:
          }*/

        regs->swreg258.sw_strm_buffer_len = MPP_ALIGN(p_hal->strm_len, 128);//
        regs->swreg5.sw_strm_start_bit    =  (dxva->frame_tag_size & 0xf) * 8; // bit start to decode
        regs->swreg6.sw_stream_len  = MPP_ALIGN(p_hal->strm_len, 128);//p_hal->strm_len - offset;
        regs->swreg259.sw_strm_start_offset = 0;
        regs->addr_cfg.swreg168.sw_stream_base_msb = 0;
        regs->addr_cfg.swreg169.sw_stream_base_lsb = mpp_buffer_get_fd(streambuf);
        mpp_dev_set_reg_offset(p_hal->dev, 169, offset);

        AV1D_DBG(AV1D_DBG_LOG, "stream len %d\n", p_hal->strm_len);
        AV1D_DBG(AV1D_DBG_LOG, "stream offset %d\n", offset);
        AV1D_DBG(AV1D_DBG_LOG, "stream tag_size %d\n", dxva->frame_tag_size);
        AV1D_DBG(AV1D_DBG_LOG, "stream start_bit %d\n", regs->swreg5.sw_strm_start_bit);
    }
    regs->swreg314.sw_dec_alignment = 64;

    regs->addr_cfg.swreg175.sw_mc_sync_curr_base_lsb = mpp_buffer_get_fd(ctx->tile_buf);
    regs->addr_cfg.swreg177.sw_mc_sync_left_base_lsb = mpp_buffer_get_fd(ctx->tile_buf);

    regs->swreg55.sw_apf_disable = 0;
    regs->swreg55.sw_apf_threshold = 8;
    regs->swreg58.sw_dec_buswidth = 2;
    regs->swreg58.sw_dec_max_burst = 16;
    regs->swreg266.sw_error_conceal_e                     = 0;
    regs->swreg265.sw_axi_rd_ostd_threshold               = 64;
    regs->swreg265.sw_axi_wr_ostd_threshold               = 64;

    regs->swreg318.sw_ext_timeout_cycles                  = 0xfffffff;
    regs->swreg318.sw_ext_timeout_override_e              = 1;
    regs->swreg319.sw_timeout_cycles                      = 0xfffffff;
    regs->swreg319.sw_timeout_override_e                  = 1;

    /* pp cfg */
    regs->vdpu_av1d_pp_cfg.swreg320.sw_pp_out_e = 1;
    regs->vdpu_av1d_pp_cfg.swreg322.sw_pp_in_format = 0;
    regs->vdpu_av1d_pp_cfg.swreg394.sw_pp0_dup_hor = 1;
    regs->vdpu_av1d_pp_cfg.swreg394.sw_pp0_dup_ver = 1;
    regs->vdpu_av1d_pp_cfg.swreg331.sw_pp_in_height = height / 2;
    regs->vdpu_av1d_pp_cfg.swreg331.sw_pp_in_width = width / 2;
    regs->vdpu_av1d_pp_cfg.swreg332.sw_pp_out_height = height;
    regs->vdpu_av1d_pp_cfg.swreg332.sw_pp_out_width = width;
    regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_y_stride = hor_stride;
    regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_c_stride = hor_stride;

    // regs->vdpu_av1d_pp_cfg.swreg337.sw_pp_in_y_stride = hor_stride;
    // regs->vdpu_av1d_pp_cfg.swreg337.sw_pp_in_c_stride = hor_stride;
    if (ctx->fbc_en) {
        RK_U32 vir_left = 0, vir_right = 0, vir_top = 0, vir_bottom = 0;
        RK_U32 bypass_filter = !regs->swreg5.sw_superres_is_scaled &&
                               !regs->swreg5.sw_enable_cdef &&
                               !regs->swreg14.sw_filt_level0 &&
                               !regs->swreg15.sw_filt_level1 &&
                               !regs->swreg18.sw_lr_type;

        regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_y_stride = dxva->bitdepth > 8 ?
                                                             width * 2 : width;
        regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_c_stride = dxva->bitdepth > 8 ?
                                                             width * 2 : width;
        regs->swreg58.sw_dec_axi_wd_id_e = 1;
        regs->swreg58.sw_dec_axi_rd_id_e = 1;
        regs->vdpu_av1d_pp_cfg.swreg320.sw_pp_out_tile_e = 1;
        regs->vdpu_av1d_pp_cfg.swreg321.sw_pp_tile_size = 2;

        vir_left = 0;
        if (((vir_left + width) % 16))
            vir_right = 16 - ((vir_left + width) % 16);
        else
            vir_right = 0;

        if (!bypass_filter)
            vir_top = 8;
        else
            vir_top = 0;

        if (((vir_top + height) % 16))
            vir_bottom = 16 - ((vir_top + height) % 16);
        else
            vir_bottom = 0;

        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_top = vir_top;
        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_left = vir_left;
        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_bottom = vir_bottom;
        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_right = vir_right;
        mpp_frame_set_offset_y(mframe, vir_top);
        mpp_frame_set_ver_stride(mframe, vir_top + height + vir_bottom);
        regs->vdpu_av1d_pp_cfg.swreg322.sw_pp_out_format = 0;
        regs->vdpu_av1d_pp_cfg.swreg326.sw_pp_out_lu_base_lsb = mpp_buffer_get_fd(buffer);
        regs->vdpu_av1d_pp_cfg.swreg328.sw_pp_out_ch_base_lsb = mpp_buffer_get_fd(buffer);
        regs->vdpu_av1d_pp_cfg.swreg505.sw_pp0_afbc_tile_base_lsb = mpp_buffer_get_fd(buffer);
    } else {
        RK_U32 out_w = hor_stride;
        RK_U32 out_h = ver_stride;
        RK_U32 y_stride = out_w * out_h;
        RK_U32 out_fmt = 0;

        if ((mpp_frame_get_fmt(mframe) & MPP_FRAME_FMT_MASK) == MPP_FMT_YUV420SP)
            out_fmt = 3;

        /*
         * out_fmt:
         * 0 is 8bit or 10bit output by syntax
         * 3 is force 8bit output
         */
        regs->vdpu_av1d_pp_cfg.swreg322.sw_pp_out_format = out_fmt;
        regs->vdpu_av1d_pp_cfg.swreg326.sw_pp_out_lu_base_lsb = mpp_buffer_get_fd(buffer);
        regs->vdpu_av1d_pp_cfg.swreg328.sw_pp_out_ch_base_lsb = mpp_buffer_get_fd(buffer);
        mpp_dev_set_reg_offset(p_hal->dev, 328, y_stride);
    }

__RETURN:
    return ret = MPP_OK;
}